

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined3 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined6 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  byte bVar41;
  ulong uVar42;
  RTCFilterFunctionN p_Var43;
  ulong uVar44;
  byte bVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  short sVar54;
  float fVar55;
  float fVar93;
  float fVar94;
  vfloat_impl<4> p00;
  undefined2 uVar92;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar95;
  undefined8 uVar96;
  float fVar115;
  vfloat4 v;
  float fVar114;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar113 [16];
  float t1;
  float fVar116;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  float fVar135;
  float fVar136;
  vfloat4 v_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar150;
  float fVar151;
  vfloat4 a;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar182;
  float fVar183;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar184;
  float fVar188;
  float fVar189;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar198;
  float fVar199;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar213;
  float fVar214;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar225;
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar233;
  float fVar234;
  vfloat4 a_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar236 [16];
  float fVar243;
  float fVar245;
  float fVar247;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar248;
  float fVar249;
  float fVar256;
  undefined8 uVar250;
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar251 [16];
  float fVar258;
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar265;
  float fVar266;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined4 local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  ulong local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  ulong local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 uVar91;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  
  PVar3 = prim[1];
  uVar44 = (ulong)(byte)PVar3;
  pPVar2 = prim + uVar44 * 0x19 + 6;
  fVar115 = *(float *)(pPVar2 + 0xc);
  fVar130 = ((ray->org).field_0.m128[0] - *(float *)pPVar2) * fVar115;
  fVar135 = ((ray->org).field_0.m128[1] - *(float *)(pPVar2 + 4)) * fVar115;
  fVar136 = ((ray->org).field_0.m128[2] - *(float *)(pPVar2 + 8)) * fVar115;
  fVar95 = fVar115 * (ray->dir).field_0.m128[0];
  fVar114 = fVar115 * (ray->dir).field_0.m128[1];
  fVar115 = fVar115 * (ray->dir).field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar44 * 4 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar42;
  auVar102._12_2_ = uVar92;
  auVar102._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar217._12_4_ = auVar102._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar42;
  auVar217._10_2_ = uVar92;
  auVar63._10_6_ = auVar217._10_6_;
  auVar63._8_2_ = uVar92;
  auVar63._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar24._4_8_ = auVar63._8_8_;
  auVar24._2_2_ = uVar92;
  auVar24._0_2_ = uVar92;
  fVar116 = (float)((int)sVar54 >> 8);
  fVar127 = (float)(auVar24._0_4_ >> 0x18);
  fVar128 = (float)(auVar63._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 5 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar42;
  auVar119._12_2_ = uVar92;
  auVar119._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar56._12_4_ = auVar119._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar42;
  auVar56._10_2_ = uVar92;
  auVar219._10_6_ = auVar56._10_6_;
  auVar219._8_2_ = uVar92;
  auVar219._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar25._4_8_ = auVar219._8_8_;
  auVar25._2_2_ = uVar92;
  auVar25._0_2_ = uVar92;
  fVar137 = (float)((int)sVar54 >> 8);
  fVar150 = (float)(auVar25._0_4_ >> 0x18);
  fVar151 = (float)(auVar219._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 6 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar42;
  auVar59._12_2_ = uVar92;
  auVar59._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._10_2_ = uVar92;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar92;
  auVar57._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar26._4_8_ = auVar57._8_8_;
  auVar26._2_2_ = uVar92;
  auVar26._0_2_ = uVar92;
  fVar190 = (float)((int)sVar54 >> 8);
  fVar198 = (float)(auVar26._0_4_ >> 0x18);
  fVar199 = (float)(auVar57._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xb + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar42;
  auVar62._12_2_ = uVar92;
  auVar62._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._10_2_ = uVar92;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar92;
  auVar60._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar27._4_8_ = auVar60._8_8_;
  auVar27._2_2_ = uVar92;
  auVar27._0_2_ = uVar92;
  fVar55 = (float)((int)sVar54 >> 8);
  fVar93 = (float)(auVar27._0_4_ >> 0x18);
  fVar94 = (float)(auVar60._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xc + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar42;
  auVar155._12_2_ = uVar92;
  auVar155._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar42;
  auVar154._10_2_ = uVar92;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar92;
  auVar153._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar28._4_8_ = auVar153._8_8_;
  auVar28._2_2_ = uVar92;
  auVar28._0_2_ = uVar92;
  fVar184 = (float)((int)sVar54 >> 8);
  fVar188 = (float)(auVar28._0_4_ >> 0x18);
  fVar189 = (float)(auVar153._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xd + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar42;
  auVar158._12_2_ = uVar92;
  auVar158._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar42;
  auVar157._10_2_ = uVar92;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar92;
  auVar156._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar29._4_8_ = auVar156._8_8_;
  auVar29._2_2_ = uVar92;
  auVar29._0_2_ = uVar92;
  fVar215 = (float)((int)sVar54 >> 8);
  fVar225 = (float)(auVar29._0_4_ >> 0x18);
  fVar226 = (float)(auVar156._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x12 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar42;
  auVar161._12_2_ = uVar92;
  auVar161._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar42;
  auVar160._10_2_ = uVar92;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar92;
  auVar159._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar30._4_8_ = auVar159._8_8_;
  auVar30._2_2_ = uVar92;
  auVar30._0_2_ = uVar92;
  fVar200 = (float)((int)sVar54 >> 8);
  fVar213 = (float)(auVar30._0_4_ >> 0x18);
  fVar214 = (float)(auVar159._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x13 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar42;
  auVar164._12_2_ = uVar92;
  auVar164._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar42;
  auVar163._10_2_ = uVar92;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar92;
  auVar162._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar31._4_8_ = auVar162._8_8_;
  auVar31._2_2_ = uVar92;
  auVar31._0_2_ = uVar92;
  fVar227 = (float)((int)sVar54 >> 8);
  fVar233 = (float)(auVar31._0_4_ >> 0x18);
  fVar234 = (float)(auVar162._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x14 + 6);
  uVar91 = (undefined1)((uint)uVar4 >> 0x18);
  uVar92 = CONCAT11(uVar91,uVar91);
  uVar91 = (undefined1)((uint)uVar4 >> 0x10);
  uVar96 = CONCAT35(CONCAT21(uVar92,uVar91),CONCAT14(uVar91,uVar4));
  uVar91 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar96 >> 0x20),uVar91),uVar91);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar42;
  auVar167._12_2_ = uVar92;
  auVar167._14_2_ = uVar92;
  uVar92 = (undefined2)((ulong)uVar96 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar42;
  auVar166._10_2_ = uVar92;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar92;
  auVar165._0_8_ = uVar42;
  uVar92 = (undefined2)uVar23;
  auVar32._4_8_ = auVar165._8_8_;
  auVar32._2_2_ = uVar92;
  auVar32._0_2_ = uVar92;
  fVar261 = (float)((int)sVar54 >> 8);
  fVar265 = (float)(auVar32._0_4_ >> 0x18);
  fVar266 = (float)(auVar165._8_4_ >> 0x18);
  fVar248 = fVar95 * fVar116 + fVar114 * fVar137 + fVar115 * fVar190;
  fVar255 = fVar95 * fVar127 + fVar114 * fVar150 + fVar115 * fVar198;
  fVar257 = fVar95 * fVar128 + fVar114 * fVar151 + fVar115 * fVar199;
  fVar259 = fVar95 * (float)(auVar217._12_4_ >> 0x18) +
            fVar114 * (float)(auVar56._12_4_ >> 0x18) + fVar115 * (float)(auVar58._12_4_ >> 0x18);
  fVar235 = fVar95 * fVar55 + fVar114 * fVar184 + fVar115 * fVar215;
  fVar242 = fVar95 * fVar93 + fVar114 * fVar188 + fVar115 * fVar225;
  fVar244 = fVar95 * fVar94 + fVar114 * fVar189 + fVar115 * fVar226;
  fVar246 = fVar95 * (float)(auVar61._12_4_ >> 0x18) +
            fVar114 * (float)(auVar154._12_4_ >> 0x18) + fVar115 * (float)(auVar157._12_4_ >> 0x18);
  fVar152 = fVar95 * fVar200 + fVar114 * fVar227 + fVar115 * fVar261;
  fVar182 = fVar95 * fVar213 + fVar114 * fVar233 + fVar115 * fVar265;
  fVar183 = fVar95 * fVar214 + fVar114 * fVar234 + fVar115 * fVar266;
  fVar95 = fVar95 * (float)(auVar160._12_4_ >> 0x18) +
           fVar114 * (float)(auVar163._12_4_ >> 0x18) + fVar115 * (float)(auVar166._12_4_ >> 0x18);
  fVar190 = fVar116 * fVar130 + fVar137 * fVar135 + fVar190 * fVar136;
  fVar198 = fVar127 * fVar130 + fVar150 * fVar135 + fVar198 * fVar136;
  fVar199 = fVar128 * fVar130 + fVar151 * fVar135 + fVar199 * fVar136;
  fVar129 = (float)(auVar217._12_4_ >> 0x18) * fVar130 +
            (float)(auVar56._12_4_ >> 0x18) * fVar135 + (float)(auVar58._12_4_ >> 0x18) * fVar136;
  fVar215 = fVar55 * fVar130 + fVar184 * fVar135 + fVar215 * fVar136;
  fVar188 = fVar93 * fVar130 + fVar188 * fVar135 + fVar225 * fVar136;
  fVar189 = fVar94 * fVar130 + fVar189 * fVar135 + fVar226 * fVar136;
  fVar225 = (float)(auVar61._12_4_ >> 0x18) * fVar130 +
            (float)(auVar154._12_4_ >> 0x18) * fVar135 + (float)(auVar157._12_4_ >> 0x18) * fVar136;
  fVar137 = fVar130 * fVar200 + fVar135 * fVar227 + fVar136 * fVar261;
  fVar150 = fVar130 * fVar213 + fVar135 * fVar233 + fVar136 * fVar265;
  fVar151 = fVar130 * fVar214 + fVar135 * fVar234 + fVar136 * fVar266;
  fVar184 = fVar130 * (float)(auVar160._12_4_ >> 0x18) +
            fVar135 * (float)(auVar163._12_4_ >> 0x18) + fVar136 * (float)(auVar166._12_4_ >> 0x18);
  fVar115 = (float)DAT_01f4bd50;
  fVar55 = DAT_01f4bd50._4_4_;
  fVar93 = DAT_01f4bd50._8_4_;
  fVar94 = DAT_01f4bd50._12_4_;
  uVar48 = -(uint)(fVar115 <= ABS(fVar248));
  uVar50 = -(uint)(fVar55 <= ABS(fVar255));
  uVar52 = -(uint)(fVar93 <= ABS(fVar257));
  uVar53 = -(uint)(fVar94 <= ABS(fVar259));
  auVar251._0_4_ = (uint)fVar248 & uVar48;
  auVar251._4_4_ = (uint)fVar255 & uVar50;
  auVar251._8_4_ = (uint)fVar257 & uVar52;
  auVar251._12_4_ = (uint)fVar259 & uVar53;
  auVar131._0_4_ = ~uVar48 & (uint)fVar115;
  auVar131._4_4_ = ~uVar50 & (uint)fVar55;
  auVar131._8_4_ = ~uVar52 & (uint)fVar93;
  auVar131._12_4_ = ~uVar53 & (uint)fVar94;
  auVar131 = auVar131 | auVar251;
  uVar48 = -(uint)(fVar115 <= ABS(fVar235));
  uVar50 = -(uint)(fVar55 <= ABS(fVar242));
  uVar52 = -(uint)(fVar93 <= ABS(fVar244));
  uVar53 = -(uint)(fVar94 <= ABS(fVar246));
  auVar236._0_4_ = (uint)fVar235 & uVar48;
  auVar236._4_4_ = (uint)fVar242 & uVar50;
  auVar236._8_4_ = (uint)fVar244 & uVar52;
  auVar236._12_4_ = (uint)fVar246 & uVar53;
  auVar138._0_4_ = ~uVar48 & (uint)fVar115;
  auVar138._4_4_ = ~uVar50 & (uint)fVar55;
  auVar138._8_4_ = ~uVar52 & (uint)fVar93;
  auVar138._12_4_ = ~uVar53 & (uint)fVar94;
  auVar138 = auVar138 | auVar236;
  uVar48 = -(uint)(fVar115 <= ABS(fVar152));
  uVar50 = -(uint)(fVar55 <= ABS(fVar182));
  uVar52 = -(uint)(fVar93 <= ABS(fVar183));
  uVar53 = -(uint)(fVar94 <= ABS(fVar95));
  auVar168._0_4_ = (uint)fVar152 & uVar48;
  auVar168._4_4_ = (uint)fVar182 & uVar50;
  auVar168._8_4_ = (uint)fVar183 & uVar52;
  auVar168._12_4_ = (uint)fVar95 & uVar53;
  auVar185._0_4_ = ~uVar48 & (uint)fVar115;
  auVar185._4_4_ = ~uVar50 & (uint)fVar55;
  auVar185._8_4_ = ~uVar52 & (uint)fVar93;
  auVar185._12_4_ = ~uVar53 & (uint)fVar94;
  auVar185 = auVar185 | auVar168;
  auVar63 = rcpps(_DAT_01f4bd50,auVar131);
  fVar115 = auVar63._0_4_;
  fVar94 = auVar63._4_4_;
  fVar116 = auVar63._8_4_;
  fVar130 = auVar63._12_4_;
  fVar115 = (1.0 - auVar131._0_4_ * fVar115) * fVar115 + fVar115;
  fVar94 = (1.0 - auVar131._4_4_ * fVar94) * fVar94 + fVar94;
  fVar116 = (1.0 - auVar131._8_4_ * fVar116) * fVar116 + fVar116;
  fVar130 = (1.0 - auVar131._12_4_ * fVar130) * fVar130 + fVar130;
  auVar63 = rcpps(auVar63,auVar138);
  fVar55 = auVar63._0_4_;
  fVar95 = auVar63._4_4_;
  fVar127 = auVar63._8_4_;
  fVar135 = auVar63._12_4_;
  fVar55 = (1.0 - auVar138._0_4_ * fVar55) * fVar55 + fVar55;
  fVar95 = (1.0 - auVar138._4_4_ * fVar95) * fVar95 + fVar95;
  fVar127 = (1.0 - auVar138._8_4_ * fVar127) * fVar127 + fVar127;
  fVar135 = (1.0 - auVar138._12_4_ * fVar135) * fVar135 + fVar135;
  auVar63 = rcpps(auVar63,auVar185);
  fVar93 = auVar63._0_4_;
  fVar114 = auVar63._4_4_;
  fVar128 = auVar63._8_4_;
  fVar136 = auVar63._12_4_;
  fVar93 = (1.0 - auVar185._0_4_ * fVar93) * fVar93 + fVar93;
  fVar114 = (1.0 - auVar185._4_4_ * fVar114) * fVar114 + fVar114;
  fVar128 = (1.0 - auVar185._8_4_ * fVar128) * fVar128 + fVar128;
  fVar136 = (1.0 - auVar185._12_4_ * fVar136) * fVar136 + fVar136;
  uVar42 = *(ulong *)(prim + uVar44 * 7 + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar42;
  auVar66._12_2_ = uVar92;
  auVar66._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar42;
  auVar65._10_2_ = uVar92;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar92;
  auVar64._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar33._4_8_ = auVar64._8_8_;
  auVar33._2_2_ = uVar92;
  auVar33._0_2_ = uVar92;
  auVar132._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar198) * fVar94,
                ((float)(int)(short)uVar42 - fVar190) * fVar115);
  auVar132._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar199) * fVar116;
  auVar132._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar129) * fVar130;
  uVar42 = *(ulong *)(prim + uVar44 * 9 + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar42;
  auVar69._12_2_ = uVar92;
  auVar69._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar42;
  auVar68._10_2_ = uVar92;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar92;
  auVar67._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar34._4_8_ = auVar67._8_8_;
  auVar34._2_2_ = uVar92;
  auVar34._0_2_ = uVar92;
  auVar186._0_4_ = ((float)(int)(short)uVar42 - fVar190) * fVar115;
  auVar186._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar198) * fVar94;
  auVar186._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar199) * fVar116;
  auVar186._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar129) * fVar130;
  uVar42 = *(ulong *)(prim + uVar44 * 0xe + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar42;
  auVar72._12_2_ = uVar92;
  auVar72._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar42;
  auVar71._10_2_ = uVar92;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar92;
  auVar70._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar35._4_8_ = auVar70._8_8_;
  auVar35._2_2_ = uVar92;
  auVar35._0_2_ = uVar92;
  auVar117._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar188) * fVar95,
                ((float)(int)(short)uVar42 - fVar215) * fVar55);
  auVar117._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar189) * fVar127;
  auVar117._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar225) * fVar135;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar42;
  auVar75._12_2_ = uVar92;
  auVar75._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar42;
  auVar74._10_2_ = uVar92;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar92;
  auVar73._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar36._4_8_ = auVar73._8_8_;
  auVar36._2_2_ = uVar92;
  auVar36._0_2_ = uVar92;
  auVar76._0_4_ = ((float)(int)(short)uVar42 - fVar215) * fVar55;
  auVar76._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar188) * fVar95;
  auVar76._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar189) * fVar127;
  auVar76._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar225) * fVar135;
  uVar42 = *(ulong *)(prim + uVar44 * 0x15 + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar42;
  auVar171._12_2_ = uVar92;
  auVar171._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar42;
  auVar170._10_2_ = uVar92;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar92;
  auVar169._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar37._4_8_ = auVar169._8_8_;
  auVar37._2_2_ = uVar92;
  auVar37._0_2_ = uVar92;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar150) * fVar114,
                ((float)(int)(short)uVar42 - fVar137) * fVar93);
  auVar172._8_4_ = ((float)(auVar169._8_4_ >> 0x10) - fVar151) * fVar128;
  auVar172._12_4_ = ((float)(auVar170._12_4_ >> 0x10) - fVar184) * fVar136;
  uVar42 = *(ulong *)(prim + uVar44 * 0x17 + 6);
  uVar92 = (undefined2)(uVar42 >> 0x30);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar42;
  auVar203._12_2_ = uVar92;
  auVar203._14_2_ = uVar92;
  uVar92 = (undefined2)(uVar42 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar42;
  auVar202._10_2_ = uVar92;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar92;
  auVar201._0_8_ = uVar42;
  uVar92 = (undefined2)(uVar42 >> 0x10);
  auVar38._4_8_ = auVar201._8_8_;
  auVar38._2_2_ = uVar92;
  auVar38._0_2_ = uVar92;
  auVar204._0_4_ = ((float)(int)(short)uVar42 - fVar137) * fVar93;
  auVar204._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar150) * fVar114;
  auVar204._8_4_ = ((float)(auVar201._8_4_ >> 0x10) - fVar151) * fVar128;
  auVar204._12_4_ = ((float)(auVar202._12_4_ >> 0x10) - fVar184) * fVar136;
  auVar216._8_4_ = auVar132._8_4_;
  auVar216._0_8_ = auVar132._0_8_;
  auVar216._12_4_ = auVar132._12_4_;
  auVar217 = minps(auVar216,auVar186);
  auVar97._8_4_ = auVar117._8_4_;
  auVar97._0_8_ = auVar117._0_8_;
  auVar97._12_4_ = auVar117._12_4_;
  auVar63 = minps(auVar97,auVar76);
  auVar217 = maxps(auVar217,auVar63);
  auVar98._8_4_ = auVar172._8_4_;
  auVar98._0_8_ = auVar172._0_8_;
  auVar98._12_4_ = auVar172._12_4_;
  auVar63 = minps(auVar98,auVar204);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar139._4_4_ = uVar4;
  auVar139._0_4_ = uVar4;
  auVar139._8_4_ = uVar4;
  auVar139._12_4_ = uVar4;
  auVar63 = maxps(auVar63,auVar139);
  auVar63 = maxps(auVar217,auVar63);
  local_188 = auVar63._0_4_ * 0.99999964;
  fStack_184 = auVar63._4_4_ * 0.99999964;
  fStack_180 = auVar63._8_4_ * 0.99999964;
  fStack_17c = auVar63._12_4_ * 0.99999964;
  auVar217 = maxps(auVar132,auVar186);
  auVar63 = maxps(auVar117,auVar76);
  auVar63 = minps(auVar217,auVar63);
  auVar217 = maxps(auVar172,auVar204);
  fVar115 = ray->tfar;
  auVar77._4_4_ = fVar115;
  auVar77._0_4_ = fVar115;
  auVar77._8_4_ = fVar115;
  auVar77._12_4_ = fVar115;
  auVar217 = minps(auVar217,auVar77);
  auVar63 = minps(auVar63,auVar217);
  auVar99._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_188 <= auVar63._0_4_ * 1.0000004);
  auVar99._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_184 <= auVar63._4_4_ * 1.0000004);
  auVar99._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_180 <= auVar63._8_4_ * 1.0000004);
  auVar99._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_17c <= auVar63._12_4_ * 1.0000004);
  uVar48 = movmskps((int)(uVar44 * 0x15),auVar99);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
LAB_002cfe63:
  local_290 = (ulong)uVar48;
  if (local_290 == 0) {
LAB_002d1e1c:
    return local_290 != 0;
  }
  lVar9 = 0;
  if (local_290 != 0) {
    for (; (uVar48 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  local_3d0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[local_3d0].ptr;
  uVar42 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar46 = (ulong)*(uint *)(uVar42 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  p_Var43 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var8 + uVar46 * (long)pvVar7);
  fVar115 = *pfVar1;
  fVar55 = pfVar1[1];
  fVar93 = pfVar1[2];
  fVar94 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar46 + 1) * (long)pvVar7);
  fVar95 = *pfVar1;
  fVar114 = pfVar1[1];
  fVar116 = pfVar1[2];
  fVar127 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar46 + 2) * (long)pvVar7);
  fVar128 = *pfVar1;
  fVar130 = pfVar1[1];
  fVar135 = pfVar1[2];
  fVar136 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar46 + 3));
  fVar137 = *pfVar1;
  fVar150 = pfVar1[1];
  fVar151 = pfVar1[2];
  fVar184 = pfVar1[3];
  lVar9 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * uVar46);
  fVar190 = *pfVar1;
  fVar198 = pfVar1[1];
  fVar199 = pfVar1[2];
  fVar129 = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 1));
  fVar152 = *pfVar1;
  fVar182 = pfVar1[1];
  fVar183 = pfVar1[2];
  fVar188 = pfVar1[3];
  uVar44 = local_290 - 1 & local_290;
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 2));
  fVar189 = *pfVar1;
  fVar200 = pfVar1[1];
  fVar213 = pfVar1[2];
  fVar214 = pfVar1[3];
  lVar10 = 0;
  if (uVar44 != 0) {
    for (; (uVar44 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 3));
  fVar215 = *pfVar1;
  fVar225 = pfVar1[1];
  fVar226 = pfVar1[2];
  fVar227 = pfVar1[3];
  if ((uVar44 != 0) && (uVar46 = uVar44 - 1 & uVar44, uVar46 != 0)) {
    lVar9 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
      }
    }
    uVar42 = (ulong)*(uint *)(uVar42 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  }
  fVar233 = fVar190 * 0.16666667 + fVar152 * 0.6666667 + fVar189 * 0.16666667 + fVar215 * 0.0;
  fVar234 = fVar198 * 0.16666667 + fVar182 * 0.6666667 + fVar200 * 0.16666667 + fVar225 * 0.0;
  fVar235 = fVar199 * 0.16666667 + fVar183 * 0.6666667 + fVar213 * 0.16666667 + fVar226 * 0.0;
  fVar242 = fVar129 * 0.16666667 + fVar188 * 0.6666667 + fVar214 * 0.16666667 + fVar227 * 0.0;
  fVar244 = ((fVar189 * 0.5 + fVar215 * 0.0) - fVar152 * 0.0) - fVar190 * 0.5;
  fVar246 = ((fVar200 * 0.5 + fVar225 * 0.0) - fVar182 * 0.0) - fVar198 * 0.5;
  fVar248 = ((fVar213 * 0.5 + fVar226 * 0.0) - fVar183 * 0.0) - fVar199 * 0.5;
  fVar255 = ((fVar214 * 0.5 + fVar227 * 0.0) - fVar188 * 0.0) - fVar129 * 0.5;
  fVar249 = fVar115 * 0.16666667 + fVar95 * 0.6666667 + fVar128 * 0.16666667 + fVar137 * 0.0;
  fVar256 = fVar55 * 0.16666667 + fVar114 * 0.6666667 + fVar130 * 0.16666667 + fVar150 * 0.0;
  fVar258 = fVar93 * 0.16666667 + fVar116 * 0.6666667 + fVar135 * 0.16666667 + fVar151 * 0.0;
  fVar260 = fVar94 * 0.16666667 + fVar127 * 0.6666667 + fVar136 * 0.16666667 + fVar184 * 0.0;
  fVar266 = ((fVar128 * 0.5 + fVar137 * 0.0) - fVar95 * 0.0) - fVar115 * 0.5;
  fVar243 = ((fVar130 * 0.5 + fVar150 * 0.0) - fVar114 * 0.0) - fVar55 * 0.5;
  fVar245 = ((fVar135 * 0.5 + fVar151 * 0.0) - fVar116 * 0.0) - fVar93 * 0.5;
  fVar247 = ((fVar136 * 0.5 + fVar184 * 0.0) - fVar127 * 0.0) - fVar94 * 0.5;
  fVar257 = fVar152 * 0.16666667 + fVar189 * 0.6666667 + fVar215 * 0.16666667 + fVar190 * 0.0;
  fVar259 = fVar182 * 0.16666667 + fVar200 * 0.6666667 + fVar225 * 0.16666667 + fVar198 * 0.0;
  fVar261 = fVar183 * 0.16666667 + fVar213 * 0.6666667 + fVar226 * 0.16666667 + fVar199 * 0.0;
  fVar265 = fVar188 * 0.16666667 + fVar214 * 0.6666667 + fVar227 * 0.16666667 + fVar129 * 0.0;
  fVar190 = ((fVar189 * 0.0 + fVar215 * 0.5) - fVar152 * 0.5) - fVar190 * 0.0;
  fVar198 = ((fVar200 * 0.0 + fVar225 * 0.5) - fVar182 * 0.5) - fVar198 * 0.0;
  fVar199 = ((fVar213 * 0.0 + fVar226 * 0.5) - fVar183 * 0.5) - fVar199 * 0.0;
  fVar129 = ((fVar214 * 0.0 + fVar227 * 0.5) - fVar188 * 0.5) - fVar129 * 0.0;
  fVar152 = fVar95 * 0.16666667 + fVar128 * 0.6666667 + fVar137 * 0.16666667 + fVar115 * 0.0;
  fVar182 = fVar114 * 0.16666667 + fVar130 * 0.6666667 + fVar150 * 0.16666667 + fVar55 * 0.0;
  fVar183 = fVar116 * 0.16666667 + fVar135 * 0.6666667 + fVar151 * 0.16666667 + fVar93 * 0.0;
  fVar188 = fVar127 * 0.16666667 + fVar136 * 0.6666667 + fVar184 * 0.16666667 + fVar94 * 0.0;
  fVar115 = ((fVar128 * 0.0 + fVar137 * 0.5) - fVar95 * 0.5) - fVar115 * 0.0;
  fVar55 = ((fVar130 * 0.0 + fVar150 * 0.5) - fVar114 * 0.5) - fVar55 * 0.0;
  fVar93 = ((fVar135 * 0.0 + fVar151 * 0.5) - fVar116 * 0.5) - fVar93 * 0.0;
  fVar94 = ((fVar136 * 0.0 + fVar184 * 0.5) - fVar127 * 0.5) - fVar94 * 0.0;
  fVar200 = fVar246 * fVar249 - fVar256 * fVar244;
  fVar214 = fVar248 * fVar256 - fVar258 * fVar246;
  fVar215 = fVar244 * fVar258 - fVar249 * fVar248;
  fVar225 = fVar255 * fVar260 - fVar260 * fVar255;
  fVar137 = fVar246 * fVar266 - fVar243 * fVar244;
  fVar151 = fVar248 * fVar243 - fVar245 * fVar246;
  fVar184 = fVar244 * fVar245 - fVar266 * fVar248;
  fVar127 = fVar198 * fVar152 - fVar182 * fVar190;
  fVar130 = fVar199 * fVar182 - fVar183 * fVar198;
  fVar135 = fVar190 * fVar183 - fVar152 * fVar199;
  fVar136 = fVar129 * fVar188 - fVar188 * fVar129;
  fVar95 = fVar198 * fVar115 - fVar55 * fVar190;
  fVar55 = fVar199 * fVar55 - fVar93 * fVar198;
  fVar93 = fVar190 * fVar93 - fVar115 * fVar199;
  fVar183 = fVar215 * fVar215 + fVar214 * fVar214 + fVar200 * fVar200;
  auVar217 = ZEXT416((uint)fVar183);
  auVar63 = rsqrtss(ZEXT416((uint)fVar183),auVar217);
  fVar115 = auVar63._0_4_;
  fVar188 = fVar115 * 1.5 - fVar115 * fVar115 * fVar183 * 0.5 * fVar115;
  fVar213 = fVar200 * fVar137 + fVar215 * fVar184 + fVar214 * fVar151;
  fVar115 = fVar225 * fVar188;
  auVar63 = rcpss(auVar217,auVar217);
  fVar150 = (2.0 - fVar183 * auVar63._0_4_) * auVar63._0_4_;
  fVar152 = fVar135 * fVar135 + fVar130 * fVar130 + fVar127 * fVar127;
  auVar63 = ZEXT416((uint)fVar152);
  auVar217 = rsqrtss(ZEXT416((uint)fVar152),auVar63);
  fVar114 = auVar217._0_4_;
  fVar128 = fVar114 * 1.5 - fVar114 * fVar114 * fVar152 * 0.5 * fVar114;
  fVar189 = fVar127 * fVar95 + fVar135 * fVar93 + fVar130 * fVar55;
  fVar116 = fVar136 * fVar128;
  auVar63 = rcpss(auVar63,auVar63);
  fVar114 = (2.0 - fVar152 * auVar63._0_4_) * auVar63._0_4_;
  local_358 = fVar242 * fVar214 * fVar188;
  fStack_354 = fVar242 * fVar215 * fVar188;
  fStack_350 = fVar242 * fVar200 * fVar188;
  fStack_34c = fVar242 * fVar115;
  local_368 = fVar233 - local_358;
  fStack_364 = fVar234 - fStack_354;
  fStack_360 = fVar235 - fStack_350;
  fStack_35c = fVar242 - fStack_34c;
  fVar151 = fVar242 * fVar150 * (fVar183 * fVar151 - fVar213 * fVar214) * fVar188 +
            fVar255 * fVar214 * fVar188;
  fVar184 = fVar242 * fVar150 * (fVar183 * fVar184 - fVar213 * fVar215) * fVar188 +
            fVar255 * fVar215 * fVar188;
  fVar182 = fVar242 * fVar150 * (fVar183 * fVar137 - fVar213 * fVar200) * fVar188 +
            fVar255 * fVar200 * fVar188;
  fVar150 = fVar242 * fVar150 * (fVar183 * (fVar255 * fVar247 - fVar247 * fVar255) -
                                fVar213 * fVar225) * fVar188 + fVar255 * fVar115;
  local_358 = local_358 + fVar233;
  fStack_354 = fStack_354 + fVar234;
  fStack_350 = fStack_350 + fVar235;
  fStack_34c = fStack_34c + fVar242;
  local_3c8 = fVar265 * fVar130 * fVar128;
  fStack_3c4 = fVar265 * fVar135 * fVar128;
  fStack_3c0 = fVar265 * fVar127 * fVar128;
  fStack_3bc = fVar265 * fVar116;
  local_388 = fVar257 - local_3c8;
  fStack_384 = fVar259 - fStack_3c4;
  fStack_380 = fVar261 - fStack_3c0;
  fStack_37c = fVar265 - fStack_3bc;
  fVar115 = fVar265 * fVar114 * (fVar152 * fVar55 - fVar189 * fVar130) * fVar128 +
            fVar129 * fVar130 * fVar128;
  fVar55 = fVar265 * fVar114 * (fVar152 * fVar93 - fVar189 * fVar135) * fVar128 +
           fVar129 * fVar135 * fVar128;
  fVar93 = fVar265 * fVar114 * (fVar152 * fVar95 - fVar189 * fVar127) * fVar128 +
           fVar129 * fVar127 * fVar128;
  fVar94 = fVar265 * fVar114 * (fVar152 * (fVar129 * fVar94 - fVar94 * fVar129) - fVar189 * fVar136)
                     * fVar128 + fVar129 * fVar116;
  local_3c8 = local_3c8 + fVar257;
  fStack_3c4 = fStack_3c4 + fVar259;
  fStack_3c0 = fStack_3c0 + fVar261;
  fStack_3bc = fStack_3bc + fVar265;
  local_378 = (fVar244 - fVar151) * 0.33333334 + local_368;
  fStack_374 = (fVar246 - fVar184) * 0.33333334 + fStack_364;
  fStack_370 = (fVar248 - fVar182) * 0.33333334 + fStack_360;
  fStack_36c = (fVar255 - fVar150) * 0.33333334 + fStack_35c;
  local_398 = local_388 - (fVar190 - fVar115) * 0.33333334;
  fStack_394 = fStack_384 - (fVar198 - fVar55) * 0.33333334;
  fStack_390 = fStack_380 - (fVar199 - fVar93) * 0.33333334;
  fStack_38c = fStack_37c - (fVar129 - fVar94) * 0.33333334;
  local_3a8 = local_3c8 - (fVar115 + fVar190) * 0.33333334;
  fStack_3a4 = fStack_3c4 - (fVar55 + fVar198) * 0.33333334;
  fStack_3a0 = fStack_3c0 - (fVar93 + fVar199) * 0.33333334;
  fStack_39c = fStack_3bc - (fVar94 + fVar129) * 0.33333334;
  fVar115 = (ray->org).field_0.m128[0];
  fVar55 = (ray->org).field_0.m128[1];
  fVar93 = (ray->org).field_0.m128[2];
  fVar94 = (pre->ray_space).vx.field_0.m128[0];
  fVar95 = (pre->ray_space).vx.field_0.m128[1];
  fVar114 = (pre->ray_space).vy.field_0.m128[0];
  fVar116 = (pre->ray_space).vy.field_0.m128[1];
  fVar127 = (pre->ray_space).vz.field_0.m128[0];
  fVar128 = (pre->ray_space).vz.field_0.m128[1];
  fVar199 = (local_368 - fVar115) * fVar94 +
            (fStack_364 - fVar55) * fVar114 + (fStack_360 - fVar93) * fVar127;
  fVar129 = (local_368 - fVar115) * fVar95 +
            (fStack_364 - fVar55) * fVar116 + (fStack_360 - fVar93) * fVar128;
  local_2d8 = CONCAT44(fVar129,fVar199);
  fVar190 = (local_378 - fVar115) * fVar94 +
            (fStack_374 - fVar55) * fVar114 + (fStack_370 - fVar93) * fVar127;
  fVar198 = (local_378 - fVar115) * fVar95 +
            (fStack_374 - fVar55) * fVar116 + (fStack_370 - fVar93) * fVar128;
  uVar250 = CONCAT44(fVar198,fVar190);
  fVar136 = (local_398 - fVar115) * fVar94 +
            (fStack_394 - fVar55) * fVar114 + (fStack_390 - fVar93) * fVar127;
  fVar137 = (local_398 - fVar115) * fVar95 +
            (fStack_394 - fVar55) * fVar116 + (fStack_390 - fVar93) * fVar128;
  local_2c8 = CONCAT44(fVar137,fVar136);
  fVar130 = (local_388 - fVar115) * fVar94 +
            (fStack_384 - fVar55) * fVar114 + (fStack_380 - fVar93) * fVar127;
  fVar135 = (local_388 - fVar115) * fVar95 +
            (fStack_384 - fVar55) * fVar116 + (fStack_380 - fVar93) * fVar128;
  uVar96 = CONCAT44(fVar135,fVar130);
  local_328 = (local_358 - fVar115) * fVar94 +
              (fStack_354 - fVar55) * fVar114 + (fStack_350 - fVar93) * fVar127;
  fStack_324 = (local_358 - fVar115) * fVar95 +
               (fStack_354 - fVar55) * fVar116 + (fStack_350 - fVar93) * fVar128;
  local_218 = (fVar151 + fVar244) * 0.33333334 + local_358;
  fStack_214 = (fVar184 + fVar246) * 0.33333334 + fStack_354;
  fStack_210 = (fVar182 + fVar248) * 0.33333334 + fStack_350;
  fStack_20c = (fVar150 + fVar255) * 0.33333334 + fStack_34c;
  fVar150 = (local_218 - fVar115) * fVar94 +
            (fStack_214 - fVar55) * fVar114 + (fStack_210 - fVar93) * fVar127;
  fVar151 = (local_218 - fVar115) * fVar95 +
            (fStack_214 - fVar55) * fVar116 + (fStack_210 - fVar93) * fVar128;
  local_338._0_8_ = CONCAT44(fVar151,fVar150);
  local_318 = (local_3a8 - fVar115) * fVar94 +
              (fStack_3a4 - fVar55) * fVar114 + (fStack_3a0 - fVar93) * fVar127;
  fStack_314 = (local_3a8 - fVar115) * fVar95 +
               (fStack_3a4 - fVar55) * fVar116 + (fStack_3a0 - fVar93) * fVar128;
  local_348 = (local_3c8 - fVar115) * fVar94 +
              (fStack_3c4 - fVar55) * fVar114 + (fStack_3c0 - fVar93) * fVar127;
  fStack_344 = (local_3c8 - fVar115) * fVar95 +
               (fStack_3c4 - fVar55) * fVar116 + (fStack_3c0 - fVar93) * fVar128;
  local_b8._12_4_ = fStack_344;
  local_b8._8_4_ = local_348;
  auVar237._8_8_ = local_338._0_8_;
  auVar237._0_8_ = uVar250;
  local_b8._0_8_ = uVar96;
  auVar78._8_4_ = local_328;
  auVar78._0_8_ = local_2d8;
  auVar78._12_4_ = fStack_324;
  auVar63 = minps(auVar78,auVar237);
  auVar100._8_4_ = local_318;
  auVar100._0_8_ = local_2c8;
  auVar100._12_4_ = fStack_314;
  auVar217 = minps(auVar100,local_b8);
  auVar63 = minps(auVar63,auVar217);
  auVar101._4_4_ = fVar129;
  auVar101._0_4_ = fVar199;
  auVar101._8_4_ = local_328;
  auVar101._12_4_ = fStack_324;
  auVar217 = maxps(auVar101,auVar237);
  auVar118._4_4_ = fVar137;
  auVar118._0_4_ = fVar136;
  auVar118._8_4_ = local_318;
  auVar118._12_4_ = fStack_314;
  auVar119 = maxps(auVar118,local_b8);
  auVar102 = maxps(auVar217,auVar119);
  auVar14._4_8_ = auVar119._8_8_;
  auVar14._0_4_ = auVar63._4_4_;
  auVar120._0_8_ = auVar14._0_8_ << 0x20;
  auVar120._8_4_ = auVar63._8_4_;
  auVar120._12_4_ = auVar63._12_4_;
  auVar121._8_8_ = auVar63._8_8_;
  auVar121._0_8_ = auVar120._8_8_;
  auVar217 = minps(auVar63,auVar121);
  auVar15._4_8_ = auVar63._8_8_;
  auVar15._0_4_ = auVar102._4_4_;
  auVar122._0_8_ = auVar15._0_8_ << 0x20;
  auVar122._8_4_ = auVar102._8_4_;
  auVar122._12_4_ = auVar102._12_4_;
  auVar123._8_8_ = auVar102._8_8_;
  auVar123._0_8_ = auVar122._8_8_;
  auVar63 = maxps(auVar102,auVar123);
  auVar79._0_8_ = auVar217._0_8_ & 0x7fffffff7fffffff;
  auVar79._8_4_ = auVar217._8_4_ & 0x7fffffff;
  auVar79._12_4_ = auVar217._12_4_ & 0x7fffffff;
  auVar103._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar103._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar103._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar79,auVar103);
  fStack_c4 = auVar63._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar63._0_4_) {
    local_c8 = auVar63._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  register0x000015c8 = local_2d8;
  register0x00001388 = uVar250;
  local_2e8 = uVar250;
  register0x00001308 = local_2c8;
  local_2f8 = local_2c8;
  register0x00001548 = uVar96;
  local_308 = uVar96;
  local_338._8_8_ = local_338._0_8_;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  _local_298 = CONCAT44(fStack_324,local_328);
  local_88 = fVar190 - fVar199;
  fStack_84 = fVar198 - fVar129;
  fStack_80 = fVar150 - local_328;
  fStack_7c = fVar151 - fStack_324;
  local_98 = fVar136 - fVar190;
  fStack_94 = fVar137 - fVar198;
  fStack_90 = local_318 - fVar150;
  fStack_8c = fStack_314 - fVar151;
  fStack_2b4 = fStack_314;
  local_2b8 = local_318;
  uStack_2b0 = local_338._0_8_;
  local_a8 = fVar130 - fVar136;
  fStack_a4 = fVar135 - fVar137;
  fStack_a0 = local_348 - local_318;
  fStack_9c = fStack_344 - fStack_314;
  local_198 = local_358 - local_368;
  fStack_194 = fStack_354 - fStack_364;
  fStack_190 = fStack_350 - fStack_360;
  fStack_18c = fStack_34c - fStack_35c;
  local_1a8 = local_218 - local_378;
  fStack_1a4 = fStack_214 - fStack_374;
  fStack_1a0 = fStack_210 - fStack_370;
  fStack_19c = fStack_20c - fStack_36c;
  local_1b8 = local_3a8 - local_398;
  fStack_1b4 = fStack_3a4 - fStack_394;
  fStack_1b0 = fStack_3a0 - fStack_390;
  fStack_1ac = fStack_39c - fStack_38c;
  local_1c8 = local_3c8 - local_388;
  fStack_1c4 = fStack_3c4 - fStack_384;
  fStack_1c0 = fStack_3c0 - fStack_380;
  fStack_1bc = fStack_3bc - fStack_37c;
  bVar45 = 0;
  uVar46 = 0;
  fVar115 = 0.0;
  fVar55 = 1.0;
  fVar93 = 0.0;
  fVar94 = 0.0;
  local_3e8 = 0.0;
  fStack_3e4 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fStack_340 = local_348;
  fStack_33c = fStack_344;
  fStack_320 = local_328;
  fStack_31c = fStack_324;
  fStack_310 = local_318;
  fStack_30c = fStack_314;
  local_2a8 = local_2d8;
LAB_002d06ef:
  fVar95 = 1.0 - fVar115;
  fVar114 = 1.0 - fVar115;
  fVar116 = 1.0 - fVar55;
  fVar127 = 1.0 - fVar55;
  fVar152 = local_2d8._0_4_ * fVar95 + local_328 * fVar115;
  fVar213 = local_2d8._4_4_ * fVar114 + fStack_324 * fVar115;
  fVar214 = local_2d8._8_4_ * fVar116 + fStack_320 * fVar55;
  fVar215 = local_2d8._12_4_ * fVar127 + fStack_31c * fVar55;
  fVar135 = local_2e8._0_4_ * fVar95 + local_338._0_4_ * fVar115;
  fVar188 = local_2e8._4_4_ * fVar114 + local_338._4_4_ * fVar115;
  fVar189 = local_2e8._8_4_ * fVar116 + local_338._8_4_ * fVar55;
  fVar200 = local_2e8._12_4_ * fVar127 + local_338._12_4_ * fVar55;
  fVar233 = local_2f8._0_4_ * fVar95 + local_318 * fVar115;
  fVar234 = local_2f8._4_4_ * fVar114 + fStack_314 * fVar115;
  fVar261 = local_2f8._8_4_ * fVar116 + fStack_310 * fVar55;
  fVar265 = local_2f8._12_4_ * fVar127 + fStack_30c * fVar55;
  fVar225 = fVar95 * local_308._0_4_ + fVar115 * local_348;
  fVar226 = fVar114 * local_308._4_4_ + fVar115 * fStack_344;
  fVar227 = fVar116 * local_308._8_4_ + fVar55 * fStack_340;
  fVar244 = fVar127 * local_308._12_4_ + fVar55 * fStack_33c;
  fVar246 = (fStack_3e4 - local_3e8) * 0.11111111;
  fVar248 = (fStack_3e4 - local_3e8) * 0.0 + local_3e8;
  fVar255 = (fStack_3e4 - local_3e8) * 0.33333334 + local_3e8;
  fVar257 = (fStack_3e4 - local_3e8) * 0.6666667 + local_3e8;
  fVar259 = (fStack_3e4 - local_3e8) * 1.0 + local_3e8;
  fVar114 = 1.0 - fVar248;
  fVar127 = 1.0 - fVar255;
  fVar130 = 1.0 - fVar257;
  fVar136 = 1.0 - fVar259;
  fVar137 = fVar135 * fVar114 + fVar233 * fVar248;
  fVar150 = fVar135 * fVar127 + fVar233 * fVar255;
  fVar151 = fVar135 * fVar130 + fVar233 * fVar257;
  fVar184 = fVar135 * fVar136 + fVar233 * fVar259;
  fVar190 = fVar188 * fVar114 + fVar234 * fVar248;
  fVar198 = fVar188 * fVar127 + fVar234 * fVar255;
  fVar199 = fVar188 * fVar130 + fVar234 * fVar257;
  fVar129 = fVar188 * fVar136 + fVar234 * fVar259;
  fVar95 = (fVar152 * fVar114 + fVar135 * fVar248) * fVar114 + fVar248 * fVar137;
  fVar116 = (fVar152 * fVar127 + fVar135 * fVar255) * fVar127 + fVar255 * fVar150;
  fVar128 = (fVar152 * fVar130 + fVar135 * fVar257) * fVar130 + fVar257 * fVar151;
  fVar135 = (fVar152 * fVar136 + fVar135 * fVar259) * fVar136 + fVar259 * fVar184;
  fVar152 = (fVar213 * fVar114 + fVar188 * fVar248) * fVar114 + fVar248 * fVar190;
  fVar182 = (fVar213 * fVar127 + fVar188 * fVar255) * fVar127 + fVar255 * fVar198;
  fVar183 = (fVar213 * fVar130 + fVar188 * fVar257) * fVar130 + fVar257 * fVar199;
  fVar188 = (fVar213 * fVar136 + fVar188 * fVar259) * fVar136 + fVar259 * fVar129;
  fVar137 = fVar137 * fVar114 + (fVar233 * fVar114 + fVar225 * fVar248) * fVar248;
  fVar150 = fVar150 * fVar127 + (fVar233 * fVar127 + fVar225 * fVar255) * fVar255;
  fVar151 = fVar151 * fVar130 + (fVar233 * fVar130 + fVar225 * fVar257) * fVar257;
  fVar184 = fVar184 * fVar136 + (fVar233 * fVar136 + fVar225 * fVar259) * fVar259;
  fVar190 = fVar190 * fVar114 + (fVar234 * fVar114 + fVar226 * fVar248) * fVar248;
  fVar198 = fVar198 * fVar127 + (fVar234 * fVar127 + fVar226 * fVar255) * fVar255;
  fVar199 = fVar199 * fVar130 + (fVar234 * fVar130 + fVar226 * fVar257) * fVar257;
  fVar129 = fVar129 * fVar136 + (fVar234 * fVar136 + fVar226 * fVar259) * fVar259;
  local_258 = fVar114 * fVar95 + fVar248 * fVar137;
  fStack_254 = fVar127 * fVar116 + fVar255 * fVar150;
  fStack_250 = fVar130 * fVar128 + fVar257 * fVar151;
  fStack_24c = fVar136 * fVar135 + fVar259 * fVar184;
  local_148 = fVar114 * fVar152 + fVar248 * fVar190;
  fStack_144 = fVar127 * fVar182 + fVar255 * fVar198;
  fStack_140 = fVar130 * fVar183 + fVar257 * fVar199;
  fStack_13c = fVar136 * fVar188 + fVar259 * fVar129;
  fVar150 = (fVar150 - fVar116) * 3.0 * fVar246;
  fVar151 = (fVar151 - fVar128) * 3.0 * fVar246;
  fVar184 = (fVar184 - fVar135) * 3.0 * fVar246;
  fVar198 = (fVar198 - fVar182) * 3.0 * fVar246;
  fVar199 = (fVar199 - fVar183) * 3.0 * fVar246;
  fVar129 = (fVar129 - fVar188) * 3.0 * fVar246;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar137 - fVar95) * 3.0 * fVar246;
  fStack_234 = fStack_254 + fVar150;
  fStack_230 = fStack_250 + fVar151;
  fStack_22c = fStack_24c + fVar184;
  fVar95 = local_148 + (fVar190 - fVar152) * 3.0 * fVar246;
  fVar116 = fStack_144 + fVar198;
  fVar128 = fStack_140 + fVar199;
  fVar135 = fStack_13c + fVar129;
  local_248._0_4_ = fStack_254 - fVar150;
  local_248._4_4_ = fStack_250 - fVar151;
  local_248._8_4_ = fStack_24c - fVar184;
  local_248._12_4_ = 0;
  local_418._0_4_ = fStack_144 - fVar198;
  local_418._4_4_ = fStack_140 - fVar199;
  fStack_410 = fStack_13c - fVar129;
  fStack_40c = 0.0;
  fVar137 = fVar189 * fVar114 + fVar261 * fVar248;
  fVar150 = fVar189 * fVar127 + fVar261 * fVar255;
  fVar151 = fVar189 * fVar130 + fVar261 * fVar257;
  fVar184 = fVar189 * fVar136 + fVar261 * fVar259;
  fVar190 = fVar200 * fVar114 + fVar265 * fVar248;
  fVar198 = fVar200 * fVar127 + fVar265 * fVar255;
  fVar199 = fVar200 * fVar130 + fVar265 * fVar257;
  fVar129 = fVar200 * fVar136 + fVar265 * fVar259;
  fVar152 = (fVar214 * fVar114 + fVar189 * fVar248) * fVar114 + fVar248 * fVar137;
  fVar182 = (fVar214 * fVar127 + fVar189 * fVar255) * fVar127 + fVar255 * fVar150;
  fVar183 = (fVar214 * fVar130 + fVar189 * fVar257) * fVar130 + fVar257 * fVar151;
  fVar188 = (fVar214 * fVar136 + fVar189 * fVar259) * fVar136 + fVar259 * fVar184;
  fVar233 = (fVar215 * fVar114 + fVar200 * fVar248) * fVar114 + fVar248 * fVar190;
  fVar234 = (fVar215 * fVar127 + fVar200 * fVar255) * fVar127 + fVar255 * fVar198;
  fVar235 = (fVar215 * fVar130 + fVar200 * fVar257) * fVar130 + fVar257 * fVar199;
  fVar242 = (fVar215 * fVar136 + fVar200 * fVar259) * fVar136 + fVar259 * fVar129;
  fVar189 = fVar137 * fVar114 + (fVar261 * fVar114 + fVar227 * fVar248) * fVar248;
  fVar200 = fVar150 * fVar127 + (fVar261 * fVar127 + fVar227 * fVar255) * fVar255;
  fVar213 = fVar151 * fVar130 + (fVar261 * fVar130 + fVar227 * fVar257) * fVar257;
  fVar214 = fVar184 * fVar136 + (fVar261 * fVar136 + fVar227 * fVar259) * fVar259;
  fVar215 = fVar190 * fVar114 + (fVar265 * fVar114 + fVar244 * fVar248) * fVar248;
  fVar225 = fVar198 * fVar127 + (fVar265 * fVar127 + fVar244 * fVar255) * fVar255;
  fVar226 = fVar199 * fVar130 + (fVar265 * fVar130 + fVar244 * fVar257) * fVar257;
  fVar227 = fVar129 * fVar136 + (fVar265 * fVar136 + fVar244 * fVar259) * fVar259;
  fVar190 = fVar114 * fVar152 + fVar248 * fVar189;
  fVar198 = fVar127 * fVar182 + fVar255 * fVar200;
  fVar199 = fVar130 * fVar183 + fVar257 * fVar213;
  fVar129 = fVar136 * fVar188 + fVar259 * fVar214;
  fVar137 = fVar114 * fVar233 + fVar248 * fVar215;
  fVar150 = fVar127 * fVar234 + fVar255 * fVar225;
  fVar151 = fVar130 * fVar235 + fVar257 * fVar226;
  fVar184 = fVar136 * fVar242 + fVar259 * fVar227;
  fVar114 = (fVar200 - fVar182) * 3.0 * fVar246;
  fVar127 = (fVar213 - fVar183) * 3.0 * fVar246;
  fVar130 = (fVar214 - fVar188) * 3.0 * fVar246;
  fVar136 = (fVar225 - fVar234) * 3.0 * fVar246;
  fVar182 = (fVar226 - fVar235) * 3.0 * fVar246;
  fVar183 = (fVar227 - fVar242) * 3.0 * fVar246;
  local_f8._4_4_ = fVar199;
  local_f8._0_4_ = fVar198;
  local_f8._8_4_ = fVar129;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar151;
  local_118._0_4_ = fVar150;
  local_118._8_4_ = fVar184;
  local_118._12_4_ = 0;
  local_138 = fVar190 + (fVar189 - fVar152) * 3.0 * fVar246;
  fStack_134 = fVar198 + fVar114;
  fStack_130 = fVar199 + fVar127;
  fStack_12c = fVar129 + fVar130;
  local_108 = fVar137 + (fVar215 - fVar233) * 3.0 * fVar246;
  fStack_104 = fVar150 + fVar136;
  fStack_100 = fVar151 + fVar182;
  fStack_fc = fVar184 + fVar183;
  local_d8._0_4_ = fVar198 - fVar114;
  local_d8._4_4_ = fVar199 - fVar127;
  local_d8._8_4_ = fVar129 - fVar130;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar150 - fVar136;
  local_128._4_4_ = fVar151 - fVar182;
  local_128._8_4_ = fVar184 - fVar183;
  local_128._12_4_ = 0;
  fVar114 = (fVar198 - fStack_254) + (fVar190 - local_258);
  fVar127 = (fVar199 - fStack_250) + (fVar198 - fStack_254);
  fVar130 = (fVar129 - fStack_24c) + (fVar199 - fStack_250);
  fVar136 = (fVar129 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar152 = (fVar150 - fStack_144) + (fVar137 - local_148);
  fVar182 = (fVar151 - fStack_140) + (fVar150 - fStack_144);
  fVar183 = (fVar184 - fStack_13c) + (fVar151 - fStack_140);
  fVar188 = (fVar184 - fStack_13c) + 0.0;
  auVar191._0_8_ =
       CONCAT44(fStack_144 * fVar127 - fStack_254 * fVar182,
                local_148 * fVar114 - local_258 * fVar152);
  auVar191._8_4_ = fStack_140 * fVar130 - fStack_250 * fVar183;
  auVar191._12_4_ = fStack_13c * fVar136 - fStack_24c * fVar188;
  auVar140._0_4_ = fVar95 * fVar114 - local_238 * fVar152;
  auVar140._4_4_ = fVar116 * fVar127 - fStack_234 * fVar182;
  auVar140._8_4_ = fVar128 * fVar130 - fStack_230 * fVar183;
  auVar140._12_4_ = fVar135 * fVar136 - fStack_22c * fVar188;
  auVar173._0_8_ =
       CONCAT44((float)local_418._4_4_ * fVar127 - fVar182 * local_248._4_4_,
                (float)local_418._0_4_ * fVar114 - fVar152 * local_248._0_4_);
  auVar173._8_4_ = fStack_410 * fVar130 - fVar183 * local_248._8_4_;
  auVar173._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
  auVar252._0_4_ = fVar114 * fStack_144 - fVar152 * fStack_254;
  auVar252._4_4_ = fVar127 * fStack_140 - fVar182 * fStack_250;
  auVar252._8_4_ = fVar130 * fStack_13c - fVar183 * fStack_24c;
  auVar252._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
  auVar218._0_8_ =
       CONCAT44(fVar150 * fVar127 - fVar198 * fVar182,fVar137 * fVar114 - fVar190 * fVar152);
  auVar218._8_4_ = fVar151 * fVar130 - fVar199 * fVar183;
  auVar218._12_4_ = fVar184 * fVar136 - fVar129 * fVar188;
  auVar264._0_4_ = local_108 * fVar114 - local_138 * fVar152;
  auVar264._4_4_ = fStack_104 * fVar127 - fStack_134 * fVar182;
  auVar264._8_4_ = fStack_100 * fVar130 - fStack_130 * fVar183;
  auVar264._12_4_ = fStack_fc * fVar136 - fStack_12c * fVar188;
  auVar205._0_8_ =
       CONCAT44(local_128._4_4_ * fVar127 - fVar182 * local_d8._4_4_,
                local_128._0_4_ * fVar114 - fVar152 * local_d8._0_4_);
  auVar205._8_4_ = local_128._8_4_ * fVar130 - fVar183 * local_d8._8_4_;
  auVar205._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
  auVar82._0_4_ = fVar114 * fVar150 - fVar152 * fVar198;
  auVar82._4_4_ = fVar127 * fVar151 - fVar182 * fVar199;
  auVar82._8_4_ = fVar130 * fVar184 - fVar183 * fVar129;
  auVar82._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
  auVar104._8_4_ = auVar191._8_4_;
  auVar104._0_8_ = auVar191._0_8_;
  auVar104._12_4_ = auVar191._12_4_;
  auVar63 = minps(auVar104,auVar140);
  auVar102 = maxps(auVar191,auVar140);
  auVar141._8_4_ = auVar173._8_4_;
  auVar141._0_8_ = auVar173._0_8_;
  auVar141._12_4_ = auVar173._12_4_;
  auVar217 = minps(auVar141,auVar252);
  auVar63 = minps(auVar63,auVar217);
  auVar217 = maxps(auVar173,auVar252);
  auVar119 = maxps(auVar102,auVar217);
  auVar142._8_4_ = auVar218._8_4_;
  auVar142._0_8_ = auVar218._0_8_;
  auVar142._12_4_ = auVar218._12_4_;
  auVar217 = minps(auVar142,auVar264);
  auVar219 = maxps(auVar218,auVar264);
  auVar174._8_4_ = auVar205._8_4_;
  auVar174._0_8_ = auVar205._0_8_;
  auVar174._12_4_ = auVar205._12_4_;
  auVar102 = minps(auVar174,auVar82);
  auVar217 = minps(auVar217,auVar102);
  auVar63 = minps(auVar63,auVar217);
  auVar217 = maxps(auVar205,auVar82);
  auVar217 = maxps(auVar219,auVar217);
  auVar217 = maxps(auVar119,auVar217);
  bVar47 = auVar63._4_4_ <= fStack_154;
  bVar12 = auVar63._8_4_ <= fStack_150;
  bVar13 = auVar63._12_4_ <= fStack_14c;
  auVar39._4_4_ = -(uint)bVar12;
  auVar39._0_4_ = -(uint)bVar47;
  auVar39._8_4_ = -(uint)bVar13;
  auVar39._12_4_ = 0;
  auVar108 = auVar39 << 0x20;
  auVar192._0_4_ =
       -(uint)(local_168 <= auVar217._0_4_ && auVar63._0_4_ <= local_158) & local_178._0_4_;
  auVar192._4_4_ = -(uint)(fStack_164 <= auVar217._4_4_ && bVar47) & local_178._4_4_;
  auVar192._8_4_ = -(uint)(fStack_160 <= auVar217._8_4_ && bVar12) & local_178._8_4_;
  auVar192._12_4_ = -(uint)(fStack_15c <= auVar217._12_4_ && bVar13) & local_178._12_4_;
  uVar48 = movmskps((int)uVar42,auVar192);
  uVar42 = (ulong)uVar48;
  if (uVar48 != 0) {
    fVar114 = (fVar198 - fVar190) + (fStack_254 - local_258);
    fVar127 = (fVar199 - fVar198) + (fStack_250 - fStack_254);
    fVar130 = (fVar129 - fVar199) + (fStack_24c - fStack_250);
    fVar136 = (0.0 - fVar129) + (0.0 - fStack_24c);
    fVar152 = (fVar150 - fVar137) + (fStack_144 - local_148);
    fVar182 = (fVar151 - fVar150) + (fStack_140 - fStack_144);
    fVar183 = (fVar184 - fVar151) + (fStack_13c - fStack_140);
    fVar188 = (0.0 - fVar184) + (0.0 - fStack_13c);
    auVar267._0_8_ =
         CONCAT44(fStack_144 * fVar127 - fStack_254 * fVar182,
                  local_148 * fVar114 - local_258 * fVar152);
    auVar267._8_4_ = fStack_140 * fVar130 - fStack_250 * fVar183;
    auVar267._12_4_ = fStack_13c * fVar136 - fStack_24c * fVar188;
    auVar143._0_4_ = fVar95 * fVar114 - local_238 * fVar152;
    auVar143._4_4_ = fVar116 * fVar127 - fStack_234 * fVar182;
    auVar143._8_4_ = fVar128 * fVar130 - fStack_230 * fVar183;
    auVar143._12_4_ = fVar135 * fVar136 - fStack_22c * fVar188;
    auVar206._0_8_ =
         CONCAT44((float)local_418._4_4_ * fVar127 - local_248._4_4_ * fVar182,
                  (float)local_418._0_4_ * fVar114 - local_248._0_4_ * fVar152);
    auVar206._8_4_ = fStack_410 * fVar130 - local_248._8_4_ * fVar183;
    auVar206._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
    auVar175._0_4_ = fStack_144 * fVar114 - fStack_254 * fVar152;
    auVar175._4_4_ = fStack_140 * fVar127 - fStack_250 * fVar182;
    auVar175._8_4_ = fStack_13c * fVar130 - fStack_24c * fVar183;
    auVar175._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
    auVar124._0_8_ =
         CONCAT44(fVar150 * fVar127 - fVar198 * fVar182,fVar137 * fVar114 - fVar190 * fVar152);
    auVar124._8_4_ = fVar151 * fVar130 - fVar199 * fVar183;
    auVar124._12_4_ = fVar184 * fVar136 - fVar129 * fVar188;
    auVar228._0_4_ = local_108 * fVar114 - local_138 * fVar152;
    auVar228._4_4_ = fStack_104 * fVar127 - fStack_134 * fVar182;
    auVar228._8_4_ = fStack_100 * fVar130 - fStack_130 * fVar183;
    auVar228._12_4_ = fStack_fc * fVar136 - fStack_12c * fVar188;
    auVar253._0_8_ =
         CONCAT44(local_128._4_4_ * fVar127 - local_d8._4_4_ * fVar182,
                  local_128._0_4_ * fVar114 - local_d8._0_4_ * fVar152);
    auVar253._8_4_ = local_128._8_4_ * fVar130 - local_d8._8_4_ * fVar183;
    auVar253._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
    auVar82._0_4_ = fVar114 * fVar150 - fVar152 * fVar198;
    auVar82._4_4_ = fVar127 * fVar151 - fVar182 * fVar199;
    auVar82._8_4_ = fVar130 * fVar184 - fVar183 * fVar129;
    auVar82._12_4_ = fVar136 * 0.0 - fVar188 * 0.0;
    auVar105._8_4_ = auVar267._8_4_;
    auVar105._0_8_ = auVar267._0_8_;
    auVar105._12_4_ = auVar267._12_4_;
    auVar63 = minps(auVar105,auVar143);
    auVar102 = maxps(auVar267,auVar143);
    auVar144._8_4_ = auVar206._8_4_;
    auVar144._0_8_ = auVar206._0_8_;
    auVar144._12_4_ = auVar206._12_4_;
    auVar217 = minps(auVar144,auVar175);
    auVar63 = minps(auVar63,auVar217);
    auVar217 = maxps(auVar206,auVar175);
    auVar219 = maxps(auVar102,auVar217);
    auVar145._8_4_ = auVar124._8_4_;
    auVar145._0_8_ = auVar124._0_8_;
    auVar145._12_4_ = auVar124._12_4_;
    auVar102 = minps(auVar145,auVar228);
    auVar217 = maxps(auVar124,auVar228);
    auVar176._8_4_ = auVar253._8_4_;
    auVar176._0_8_ = auVar253._0_8_;
    auVar176._12_4_ = auVar253._12_4_;
    auVar119 = minps(auVar176,auVar82);
    auVar102 = minps(auVar102,auVar119);
    auVar63 = minps(auVar63,auVar102);
    auVar102 = maxps(auVar253,auVar82);
    auVar217 = maxps(auVar217,auVar102);
    auVar217 = maxps(auVar219,auVar217);
    bVar47 = auVar63._4_4_ <= fStack_154;
    bVar12 = auVar63._8_4_ <= fStack_150;
    bVar13 = auVar63._12_4_ <= fStack_14c;
    auVar40._4_4_ = -(uint)bVar12;
    auVar40._0_4_ = -(uint)bVar47;
    auVar40._8_4_ = -(uint)bVar13;
    auVar40._12_4_ = 0;
    auVar108 = auVar40 << 0x20;
    auVar268._0_4_ =
         -(uint)(local_168 <= auVar217._0_4_ && auVar63._0_4_ <= local_158) & auVar192._0_4_;
    auVar268._4_4_ = -(uint)(fStack_164 <= auVar217._4_4_ && bVar47) & auVar192._4_4_;
    auVar268._8_4_ = -(uint)(fStack_160 <= auVar217._8_4_ && bVar12) & auVar192._8_4_;
    auVar268._12_4_ = -(uint)(fStack_15c <= auVar217._12_4_ && bVar13) & auVar192._12_4_;
    uVar48 = movmskps(uVar48,auVar268);
    uVar42 = (ulong)uVar48;
    auVar264 = local_118;
    if (uVar48 != 0) {
      uVar42 = (ulong)(byte)uVar48;
      auStack_208[uVar46] = uVar48 & 0xff;
      *(ulong *)(afStack_78 + uVar46 * 2) = CONCAT44(fStack_3e4,local_3e8);
      auVar82._8_4_ = fVar93;
      auVar82._0_8_ = CONCAT44(fVar55,fVar115);
      auVar82._12_4_ = fVar94;
      *(ulong *)(afStack_58 + uVar46 * 2) = CONCAT44(fVar55,fVar115);
      uVar46 = (ulong)((int)uVar46 + 1);
    }
  }
LAB_002d0d49:
  auVar63 = _local_418;
  if ((int)uVar46 == 0) {
    if (bVar45 != 0) goto LAB_002d1e1c;
    fVar115 = ray->tfar;
    auVar113._4_4_ = -(uint)(fStack_184 <= fVar115);
    auVar113._0_4_ = -(uint)(local_188 <= fVar115);
    auVar113._8_4_ = -(uint)(fStack_180 <= fVar115);
    auVar113._12_4_ = -(uint)(fStack_17c <= fVar115);
    uVar48 = movmskps((int)uVar42,auVar113);
    uVar48 = (uint)uVar44 & uVar48;
    goto LAB_002cfe63;
  }
  uVar50 = (int)uVar46 - 1;
  uVar42 = (ulong)uVar50;
  uVar48 = auStack_208[uVar42];
  fVar115 = afStack_58[uVar42 * 2];
  fVar55 = afStack_58[uVar42 * 2 + 1];
  fVar93 = 0.0;
  fVar94 = 0.0;
  uVar11 = 0;
  if (uVar48 != 0) {
    for (; (uVar48 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
    }
  }
  uVar48 = uVar48 - 1 & uVar48;
  auStack_208[uVar42] = uVar48;
  if (uVar48 == 0) {
    uVar46 = (ulong)uVar50;
  }
  fVar116 = (float)(uVar11 + 1) * 0.33333334;
  fVar127 = auVar82._4_4_ * 0.0;
  fVar128 = auVar108._4_4_ * 0.0;
  fVar95 = afStack_78[uVar42 * 2];
  fVar114 = afStack_78[uVar42 * 2 + 1];
  local_3e8 = fVar95 * (1.0 - (float)uVar11 * 0.33333334) + fVar114 * (float)uVar11 * 0.33333334;
  fStack_3e4 = fVar95 * (1.0 - fVar116) + fVar114 * fVar116;
  fStack_3e0 = fVar95 * (0.0 - fVar127) + fVar114 * fVar127;
  fStack_3dc = fVar95 * (0.0 - fVar128) + fVar114 * fVar128;
  fVar95 = fStack_3e4 - local_3e8;
  if (fVar95 < 0.16666667) {
    fVar128 = 1.0 - fVar115;
    fVar135 = 1.0 - fVar115;
    fVar150 = 1.0 - fVar55;
    fVar151 = 1.0 - fVar55;
    fVar127 = (float)local_2d8._0_4_ * fVar128 + local_328 * fVar115;
    fVar130 = (float)local_2d8._4_4_ * fVar135 + fStack_324 * fVar115;
    fVar136 = fStack_2d0 * fVar150 + fStack_320 * fVar55;
    fVar137 = fStack_2cc * fVar151 + fStack_31c * fVar55;
    fVar93 = (float)local_2e8._0_4_ * fVar128 + local_338._0_4_ * fVar115;
    fVar94 = (float)local_2e8._4_4_ * fVar135 + local_338._4_4_ * fVar115;
    fVar114 = fStack_2e0 * fVar150 + local_338._8_4_ * fVar55;
    fVar116 = fStack_2dc * fVar151 + local_338._12_4_ * fVar55;
    fVar129 = (float)local_2f8._0_4_ * fVar128 + local_318 * fVar115;
    fVar182 = (float)local_2f8._4_4_ * fVar135 + fStack_314 * fVar115;
    fVar188 = fStack_2f0 * fVar150 + fStack_310 * fVar55;
    fVar200 = fStack_2ec * fVar151 + fStack_30c * fVar55;
    fVar184 = (fVar128 * (float)local_308._0_4_ + fVar115 * local_348) - fVar129;
    fVar190 = (fVar135 * (float)local_308._4_4_ + fVar115 * fStack_344) - fVar182;
    fVar198 = (fVar150 * fStack_300 + fVar55 * fStack_340) - fVar188;
    fVar199 = (fVar151 * fStack_2fc + fVar55 * fStack_33c) - fVar200;
    fVar128 = local_3e8 * (fVar129 - fVar93) + fVar93;
    fVar135 = local_3e8 * (fVar182 - fVar94) + fVar94;
    fVar150 = local_3e8 * (fVar188 - fVar114) + fVar114;
    fVar151 = local_3e8 * (fVar200 - fVar116) + fVar116;
    fVar152 = (fVar129 - fVar93) * fStack_3e4 + fVar93;
    fVar183 = (fVar182 - fVar94) * fStack_3e4 + fVar94;
    fVar189 = (fVar188 - fVar114) * fStack_3e4 + fVar114;
    fVar213 = (fVar200 - fVar116) * fStack_3e4 + fVar116;
    fVar214 = local_3e8 * (fVar93 - fVar127) + fVar127;
    fVar215 = local_3e8 * (fVar94 - fVar130) + fVar130;
    fVar225 = local_3e8 * (fVar114 - fVar136) + fVar136;
    fVar226 = local_3e8 * (fVar116 - fVar137) + fVar137;
    fVar214 = (fVar128 - fVar214) * local_3e8 + fVar214;
    fVar215 = (fVar135 - fVar215) * local_3e8 + fVar215;
    fVar225 = (fVar150 - fVar225) * local_3e8 + fVar225;
    fVar226 = (fVar151 - fVar226) * local_3e8 + fVar226;
    fVar128 = (((local_3e8 * fVar184 + fVar129) - fVar128) * local_3e8 + fVar128) - fVar214;
    fVar135 = (((local_3e8 * fVar190 + fVar182) - fVar135) * local_3e8 + fVar135) - fVar215;
    fVar150 = (((local_3e8 * fVar198 + fVar188) - fVar150) * local_3e8 + fVar150) - fVar225;
    fVar151 = (((local_3e8 * fVar199 + fVar200) - fVar151) * local_3e8 + fVar151) - fVar226;
    auVar125._0_4_ = local_3e8 * fVar128 + fVar214;
    auVar125._4_4_ = local_3e8 * fVar135 + fVar215;
    auVar125._8_4_ = local_3e8 * fVar150 + fVar225;
    auVar125._12_4_ = local_3e8 * fVar151 + fVar226;
    fVar127 = (fVar93 - fVar127) * fStack_3e4 + fVar127;
    fVar130 = (fVar94 - fVar130) * fStack_3e4 + fVar130;
    fVar136 = (fVar114 - fVar136) * fStack_3e4 + fVar136;
    fVar137 = (fVar116 - fVar137) * fStack_3e4 + fVar137;
    fVar127 = (fVar152 - fVar127) * fStack_3e4 + fVar127;
    fVar130 = (fVar183 - fVar130) * fStack_3e4 + fVar130;
    fVar136 = (fVar189 - fVar136) * fStack_3e4 + fVar136;
    fVar137 = (fVar213 - fVar137) * fStack_3e4 + fVar137;
    fVar94 = (((fVar184 * fStack_3e4 + fVar129) - fVar152) * fStack_3e4 + fVar152) - fVar127;
    fVar114 = (((fVar190 * fStack_3e4 + fVar182) - fVar183) * fStack_3e4 + fVar183) - fVar130;
    fVar116 = (((fVar198 * fStack_3e4 + fVar188) - fVar189) * fStack_3e4 + fVar189) - fVar136;
    fVar183 = (((fVar199 * fStack_3e4 + fVar200) - fVar213) * fStack_3e4 + fVar213) - fVar137;
    fVar127 = fStack_3e4 * fVar94 + fVar127;
    fVar130 = fStack_3e4 * fVar114 + fVar130;
    fVar136 = fStack_3e4 * fVar116 + fVar136;
    fVar137 = fStack_3e4 * fVar183 + fVar137;
    fVar93 = fVar95 * 0.33333334;
    fVar184 = fVar128 * (float)DAT_01f4afa0 * fVar93 + auVar125._0_4_;
    fVar190 = fVar135 * DAT_01f4afa0._4_4_ * fVar93 + auVar125._4_4_;
    fVar198 = fVar150 * DAT_01f4afa0._8_4_ * fVar93 + auVar125._8_4_;
    fVar199 = fVar151 * DAT_01f4afa0._12_4_ * fVar93 + auVar125._12_4_;
    fVar129 = fVar127 - fVar93 * fVar94 * (float)DAT_01f4afa0;
    fVar152 = fVar130 - fVar93 * fVar114 * DAT_01f4afa0._4_4_;
    fVar182 = fVar136 - fVar93 * fVar116 * DAT_01f4afa0._8_4_;
    fVar183 = fVar137 - fVar93 * fVar183 * DAT_01f4afa0._12_4_;
    auVar16._4_8_ = auVar264._8_8_;
    auVar16._0_4_ = auVar125._4_4_;
    auVar262._0_8_ = auVar16._0_8_ << 0x20;
    auVar262._8_4_ = auVar125._8_4_;
    auVar262._12_4_ = auVar125._12_4_;
    local_3b8._8_8_ = auVar125._8_8_;
    local_3b8._0_8_ = auVar262._8_8_;
    auVar17._4_8_ = DAT_01f4afa0._8_8_;
    auVar17._0_4_ = fVar130;
    auVar207._0_8_ = auVar17._0_8_ << 0x20;
    auVar207._8_4_ = fVar136;
    auVar207._12_4_ = fVar137;
    fVar128 = (fVar136 - fVar127) + (auVar125._8_4_ - auVar125._0_4_);
    fVar135 = (fVar137 - fVar130) + (auVar125._12_4_ - auVar125._4_4_);
    auVar220._0_4_ = fVar152 * fVar135;
    auVar220._4_4_ = fVar152 * fVar135;
    auVar220._8_4_ = fVar183 * fVar135;
    auVar220._12_4_ = fVar183 * fVar135;
    fVar93 = auVar125._0_4_ * fVar128 + auVar125._4_4_ * fVar135;
    fVar94 = auVar125._8_4_ * fVar128 + auVar125._12_4_ * fVar135;
    fVar150 = fVar184 * fVar128 + fVar190 * fVar135;
    fVar151 = fVar198 * fVar128 + fVar199 * fVar135;
    fVar188 = fVar129 * fVar128 + auVar220._0_4_;
    auVar193._0_8_ = CONCAT44(fVar152 * fVar128 + auVar220._4_4_,fVar188);
    auVar193._8_4_ = fVar182 * fVar128 + auVar220._8_4_;
    auVar193._12_4_ = fVar183 * fVar128 + auVar220._12_4_;
    fVar116 = fVar128 * fVar127 + fVar135 * fVar130;
    fVar189 = fVar128 * fVar136 + fVar135 * fVar137;
    auVar18._4_8_ = auVar220._8_8_;
    auVar18._0_4_ = fVar190 * fVar128 + fVar190 * fVar135;
    auVar221._0_8_ = auVar18._0_8_ << 0x20;
    auVar221._8_4_ = fVar151;
    auVar221._12_4_ = fVar199 * fVar128 + fVar199 * fVar135;
    fVar114 = fVar150;
    if (fVar150 <= fVar93) {
      fVar114 = fVar93;
      fVar93 = fVar150;
    }
    auVar222._8_8_ = auVar221._8_8_;
    auVar222._0_8_ = auVar222._8_8_;
    auVar80._8_4_ = auVar193._8_4_;
    auVar80._0_8_ = auVar193._0_8_;
    auVar80._12_4_ = auVar193._12_4_;
    if (fVar116 <= fVar188) {
      auVar80._0_4_ = fVar116;
    }
    if (auVar80._0_4_ <= fVar93) {
      fVar93 = auVar80._0_4_;
    }
    auVar19._4_8_ = auVar80._8_8_;
    auVar19._0_4_ = fVar128 * fVar130 + fVar135 * fVar130;
    auVar81._0_8_ = auVar19._0_8_ << 0x20;
    auVar81._8_4_ = fVar189;
    auVar81._12_4_ = fVar128 * fVar137 + fVar135 * fVar137;
    if (fVar116 <= fVar188) {
      fVar116 = fVar188;
    }
    auVar82._8_8_ = auVar81._8_8_;
    auVar82._0_8_ = auVar82._8_8_;
    if (fVar116 <= fVar114) {
      fVar116 = fVar114;
    }
    if (fVar151 <= fVar94) {
      auVar222._0_4_ = fVar94;
      fVar94 = fVar151;
    }
    auVar106._8_4_ = auVar193._8_4_;
    auVar106._0_8_ = auVar193._8_8_;
    auVar106._12_4_ = auVar193._12_4_;
    if (fVar189 <= auVar193._8_4_) {
      auVar106._0_4_ = fVar189;
    }
    if (auVar106._0_4_ <= fVar94) {
      fVar94 = auVar106._0_4_;
    }
    if (fVar189 <= auVar193._8_4_) {
      auVar82._0_4_ = auVar193._8_4_;
    }
    if (auVar82._0_4_ <= auVar222._0_4_) {
      auVar82._0_4_ = auVar222._0_4_;
    }
    bVar47 = 3 < (uint)uVar46;
    uVar20 = (undefined3)(uVar50 >> 8);
    uVar42 = (ulong)CONCAT31(uVar20,bVar47);
    fVar114 = auVar82._0_4_;
    if ((0.0001 <= fVar93) || (fVar114 <= -0.0001)) goto LAB_002d1066;
    goto LAB_002d10b0;
  }
  goto LAB_002d06ef;
LAB_002d1066:
  auVar108._0_12_ = ZEXT812(0x38d1b717);
  auVar108._12_4_ = 0.0;
  if ((0.0001 <= fVar94 || fVar116 <= -0.0001) &&
     ((0.0001 <= fVar93 || fVar116 <= -0.0001 &&
      (auVar264 = local_3b8, 0.0001 <= fVar94 || fVar114 <= -0.0001)))) goto LAB_002d0d49;
LAB_002d10b0:
  local_418 = (undefined1  [8])auVar207._8_8_;
  bVar47 = bVar47 || fVar95 < 0.001;
  uVar42 = (ulong)CONCAT31(uVar20,bVar47);
  fVar135 = (float)(~-(uint)(fVar93 < 0.0) & 0x3f800000 | -(uint)(fVar93 < 0.0) & 0xbf800000);
  fVar150 = (float)(~-(uint)(fVar116 < 0.0) & 0x3f800000 | -(uint)(fVar116 < 0.0) & 0xbf800000);
  fVar128 = 0.0;
  if ((fVar135 == fVar150) && (!NAN(fVar135) && !NAN(fVar150))) {
    fVar128 = INFINITY;
  }
  fVar151 = 0.0;
  if ((fVar135 == fVar150) && (!NAN(fVar135) && !NAN(fVar150))) {
    fVar151 = -INFINITY;
  }
  fVar188 = (float)(~-(uint)(fVar94 < 0.0) & 0x3f800000 | -(uint)(fVar94 < 0.0) & 0xbf800000);
  if ((fVar135 != fVar188) || (fVar189 = fVar151, NAN(fVar135) || NAN(fVar188))) {
    if ((fVar94 != fVar93) || (NAN(fVar94) || NAN(fVar93))) {
      fVar94 = -fVar93 / (fVar94 - fVar93);
      fVar94 = (1.0 - fVar94) * 0.0 + fVar94;
      fVar189 = fVar94;
    }
    else {
      fVar94 = 0.0;
      if ((fVar93 != 0.0) || (fVar189 = 1.0, NAN(fVar93))) {
        fVar94 = INFINITY;
        fVar189 = -INFINITY;
      }
    }
    if (fVar94 <= fVar128) {
      fVar128 = fVar94;
    }
    if (fVar189 <= fVar151) {
      fVar189 = fVar151;
    }
  }
  fVar93 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar114 < 0.0) * 4);
  if ((fVar150 != fVar93) || (fVar94 = fVar189, NAN(fVar150) || NAN(fVar93))) {
    if ((fVar114 != fVar116) || (NAN(fVar114) || NAN(fVar116))) {
      fVar135 = -fVar116 / (fVar114 - fVar116);
      fVar135 = (1.0 - fVar135) * 0.0 + fVar135;
      fVar94 = fVar135;
    }
    else {
      fVar135 = 0.0;
      if ((fVar116 != 0.0) || (fVar94 = 1.0, NAN(fVar116))) {
        fVar135 = INFINITY;
        fVar94 = -INFINITY;
      }
    }
    if (fVar135 <= fVar128) {
      fVar128 = fVar135;
    }
    if (fVar94 <= fVar189) {
      fVar94 = fVar189;
    }
  }
  if ((fVar188 != fVar93) || (NAN(fVar188) || NAN(fVar93))) {
    fVar128 = (float)(~-(uint)(fVar128 < 1.0) & 0x3f800000 | (uint)fVar128 & -(uint)(fVar128 < 1.0))
    ;
    fVar94 = (float)(~-(uint)(fVar94 < 1.0) & (uint)fVar94 | -(uint)(fVar94 < 1.0) & 0x3f800000);
  }
  auVar107._0_8_ =
       CONCAT44(~-(uint)(fVar94 < 1.0),~-(uint)(fVar128 < 0.0) & (uint)fVar128) & 0x3f800000ffffffff
  ;
  auVar107._8_8_ = 0;
  auVar108 = auVar107 | ZEXT416((uint)fVar94 & -(uint)(fVar94 < 1.0)) << 0x20;
  fVar93 = auVar108._4_4_;
  auVar82._4_4_ = fVar93;
  auVar82._0_4_ = fVar93;
  auVar82._8_4_ = fVar93;
  auVar82._12_4_ = fVar93;
  auVar264 = _local_418;
  if (fVar93 < auVar108._0_4_) goto LAB_002d0d49;
  fVar116 = auVar108._0_4_ + -0.1;
  fVar94 = auVar108._8_4_ + 0.0;
  fVar135 = auVar108._12_4_ + 0.0;
  uVar48 = -(uint)(fVar93 + 0.1 < 1.0);
  fVar116 = (float)(~-(uint)(fVar116 < 0.0) & (uint)fVar116);
  fVar128 = (float)(~uVar48 & 0x3f800000 | (uint)(fVar93 + 0.1) & uVar48);
  fVar93 = 1.0 - fVar116;
  fVar214 = 1.0 - fVar116;
  fVar215 = 1.0 - fVar128;
  fVar225 = 1.0 - fVar128;
  fVar150 = auVar125._0_4_ * fVar93 + auVar125._8_4_ * fVar116;
  fVar151 = auVar125._4_4_ * fVar214 + auVar125._12_4_ * fVar116;
  fVar188 = auVar125._0_4_ * fVar215 + auVar125._8_4_ * fVar128;
  fVar189 = auVar125._4_4_ * fVar225 + auVar125._12_4_ * fVar128;
  fVar200 = fVar184 * fVar93 + fVar198 * fVar116;
  fVar213 = fVar190 * fVar214 + fVar199 * fVar116;
  fVar184 = fVar184 * fVar215 + fVar198 * fVar128;
  fVar190 = fVar190 * fVar225 + fVar199 * fVar128;
  fVar198 = fVar129 * fVar93 + fVar182 * fVar116;
  fVar199 = fVar152 * fVar214 + fVar183 * fVar116;
  fVar129 = fVar129 * fVar215 + fVar182 * fVar128;
  fVar152 = fVar152 * fVar225 + fVar183 * fVar128;
  fVar136 = fVar93 * fVar127 + fVar136 * fVar116;
  fVar137 = fVar214 * fVar130 + fVar137 * fVar116;
  fVar182 = fVar215 * fVar127 + auVar63._8_4_ * fVar128;
  fVar183 = fVar225 * fVar130 + auVar63._12_4_ * fVar128;
  fVar127 = fVar55 * fVar94;
  fVar130 = fVar55 * fVar135;
  fVar214 = fVar115 * (1.0 - fVar128);
  fVar93 = fVar115 * (0.0 - fVar94);
  fVar94 = fVar115 * (0.0 - fVar135);
  fVar115 = fVar115 * (1.0 - fVar116) + fVar55 * fVar116;
  fVar55 = fVar214 + fVar55 * fVar128;
  fVar93 = fVar93 + fVar127;
  fVar94 = fVar94 + fVar130;
  fVar95 = 1.0 / fVar95;
  auVar109._0_4_ = fVar182 - fVar136;
  auVar109._4_4_ = fVar183 - fVar137;
  auVar109._8_4_ = fVar182 - fVar182;
  auVar109._12_4_ = fVar183 - fVar183;
  auVar133._0_8_ = CONCAT44(fVar152 - fVar199,fVar129 - fVar198);
  auVar133._8_4_ = fVar129 - fVar129;
  auVar133._12_4_ = fVar152 - fVar152;
  auVar177._0_4_ = fVar184 - fVar200;
  auVar177._4_4_ = fVar190 - fVar213;
  auVar177._8_4_ = fVar184 - fVar184;
  auVar177._12_4_ = fVar190 - fVar190;
  auVar223._0_8_ = CONCAT44((fVar213 - fVar151) * 3.0,(fVar200 - fVar150) * 3.0);
  auVar223._8_4_ = (fVar184 - fVar188) * 3.0;
  auVar223._12_4_ = (fVar190 - fVar189) * 3.0;
  auVar146._0_8_ = CONCAT44((fVar199 - fVar213) * 3.0,(fVar198 - fVar200) * 3.0);
  auVar146._8_4_ = (fVar129 - fVar184) * 3.0;
  auVar146._12_4_ = (fVar152 - fVar190) * 3.0;
  auVar238._0_4_ = (fVar136 - fVar198) * 3.0;
  auVar238._4_4_ = (fVar137 - fVar199) * 3.0;
  auVar238._8_4_ = (fVar182 - fVar129) * 3.0;
  auVar238._12_4_ = (fVar183 - fVar152) * 3.0;
  auVar194._8_4_ = auVar146._8_4_;
  auVar194._0_8_ = auVar146._0_8_;
  auVar194._12_4_ = auVar146._12_4_;
  auVar217 = minps(auVar194,auVar238);
  auVar63 = maxps(auVar146,auVar238);
  auVar229._8_4_ = auVar223._8_4_;
  auVar229._0_8_ = auVar223._0_8_;
  auVar229._12_4_ = auVar223._12_4_;
  auVar119 = minps(auVar229,auVar217);
  auVar102 = maxps(auVar223,auVar63);
  auVar21._4_8_ = auVar63._8_8_;
  auVar21._0_4_ = auVar119._4_4_;
  auVar147._0_8_ = auVar21._0_8_ << 0x20;
  auVar147._8_4_ = auVar119._8_4_;
  auVar147._12_4_ = auVar119._12_4_;
  auVar148._8_8_ = auVar119._8_8_;
  auVar148._0_8_ = auVar147._8_8_;
  auVar22._4_8_ = auVar217._8_8_;
  auVar22._0_4_ = auVar102._4_4_;
  auVar195._0_8_ = auVar22._0_8_ << 0x20;
  auVar195._8_4_ = auVar102._8_4_;
  auVar195._12_4_ = auVar102._12_4_;
  auVar196._8_8_ = auVar102._8_8_;
  auVar196._0_8_ = auVar195._8_8_;
  auVar217 = minps(auVar119,auVar148);
  auVar63 = maxps(auVar102,auVar196);
  fVar225 = auVar217._0_4_ * fVar95;
  fVar226 = auVar217._4_4_ * fVar95;
  fVar227 = auVar217._8_4_ * fVar95;
  fVar233 = auVar217._12_4_ * fVar95;
  fVar199 = fVar95 * auVar63._0_4_;
  fVar152 = fVar95 * auVar63._4_4_;
  fVar183 = fVar95 * auVar63._8_4_;
  fVar95 = fVar95 * auVar63._12_4_;
  fVar214 = 1.0 / (fVar55 - fVar115);
  auVar83._0_8_ = CONCAT44(fVar189 - fVar151,fVar188 - fVar150);
  auVar83._8_4_ = fVar188 - fVar188;
  auVar83._12_4_ = fVar189 - fVar189;
  auVar208._8_4_ = auVar83._8_4_;
  auVar208._0_8_ = auVar83._0_8_;
  auVar208._12_4_ = auVar83._12_4_;
  auVar102 = minps(auVar208,auVar177);
  auVar63 = maxps(auVar83,auVar177);
  auVar126._8_4_ = auVar133._8_4_;
  auVar126._0_8_ = auVar133._0_8_;
  auVar126._12_4_ = auVar133._12_4_;
  auVar217 = minps(auVar126,auVar109);
  auVar102 = minps(auVar102,auVar217);
  auVar217 = maxps(auVar133,auVar109);
  auVar63 = maxps(auVar63,auVar217);
  fVar200 = auVar102._0_4_ * fVar214;
  fVar213 = auVar102._4_4_ * fVar214;
  fVar215 = fVar214 * auVar63._0_4_;
  fVar214 = fVar214 * auVar63._4_4_;
  local_418._4_4_ = fVar115;
  local_418._0_4_ = local_3e8;
  fStack_410 = fStack_3e4;
  fStack_40c = fVar55;
  auVar197._4_4_ = fVar55;
  auVar197._0_4_ = fStack_3e4;
  auVar197._8_4_ = fStack_3e0;
  auVar197._12_4_ = fStack_3dc;
  local_1ec = (local_3e8 + fStack_3e4) * 0.5;
  fVar151 = (fVar115 + fVar55) * 0.5;
  fVar184 = (fStack_3e4 + fStack_3e0) * 0.0;
  fVar190 = (fVar55 + fStack_3dc) * 0.0;
  fVar116 = local_88 * local_1ec + (float)local_2a8;
  fVar127 = fStack_84 * local_1ec + local_2a8._4_4_;
  fVar128 = fStack_80 * local_1ec + fStack_2a0;
  fVar130 = fStack_7c * local_1ec + fStack_29c;
  fVar135 = local_98 * local_1ec + local_2b8;
  fVar136 = fStack_94 * local_1ec + fStack_2b4;
  fVar137 = fStack_90 * local_1ec + (float)uStack_2b0;
  fVar150 = fStack_8c * local_1ec + uStack_2b0._4_4_;
  fVar116 = (fVar135 - fVar116) * local_1ec + fVar116;
  fVar127 = (fVar136 - fVar127) * local_1ec + fVar127;
  fVar128 = (fVar137 - fVar128) * local_1ec + fVar128;
  fVar130 = (fVar150 - fVar130) * local_1ec + fVar130;
  fVar135 = (((local_a8 * local_1ec + (float)local_2c8) - fVar135) * local_1ec + fVar135) - fVar116;
  fVar136 = (((fStack_a4 * local_1ec + local_2c8._4_4_) - fVar136) * local_1ec + fVar136) - fVar127;
  fVar137 = (((fStack_a0 * local_1ec + fStack_2c0) - fVar137) * local_1ec + fVar137) - fVar128;
  fVar150 = (((fStack_9c * local_1ec + fStack_2bc) - fVar150) * local_1ec + fVar150) - fVar130;
  fVar116 = local_1ec * fVar135 + fVar116;
  fVar127 = local_1ec * fVar136 + fVar127;
  fVar135 = fVar135 * 3.0;
  fVar136 = fVar136 * 3.0;
  fVar128 = (local_1ec * fVar137 + fVar128) - fVar116;
  fVar130 = (local_1ec * fVar150 + fVar130) - fVar127;
  fVar135 = (fVar137 * 3.0 - fVar135) * fVar151 + fVar135;
  fVar136 = (fVar150 * 3.0 - fVar136) * fVar151 + fVar136;
  auVar134._0_8_ = CONCAT44(fVar135,fVar128) ^ 0x80000000;
  auVar134._8_4_ = fVar135;
  auVar134._12_4_ = fVar135;
  fVar234 = local_3e8 - local_1ec;
  fVar235 = fVar115 - fVar151;
  fVar242 = fStack_3e4 - fVar184;
  fVar244 = fVar55 - fVar190;
  fVar246 = fStack_3e4 - local_1ec;
  fVar248 = fVar55 - fVar151;
  fVar184 = fStack_3e0 - fVar184;
  fVar190 = fStack_3dc - fVar190;
  fVar116 = fVar128 * fVar151 + fVar116;
  fVar127 = fVar130 * fVar151 + fVar127;
  auVar149._0_8_ = CONCAT44(fVar136,fVar130) ^ 0x8000000000000000;
  auVar149._8_4_ = -fVar136;
  auVar149._12_4_ = -fVar136;
  auVar84._0_4_ = fVar130 * fVar135 - fVar136 * fVar128;
  auVar84._4_4_ = auVar84._0_4_;
  auVar84._8_4_ = auVar84._0_4_;
  auVar84._12_4_ = auVar84._0_4_;
  auVar217 = divps(auVar149,auVar84);
  auVar63 = divps(auVar134,auVar84);
  fVar150 = auVar217._0_4_;
  fVar198 = auVar217._4_4_;
  fVar136 = auVar63._0_4_;
  fVar137 = auVar63._4_4_;
  local_1ec = local_1ec - (fVar127 * fVar136 + fVar116 * fVar150);
  fStack_1e8 = fVar151 - (fVar127 * fVar137 + fVar116 * fVar198);
  fVar135 = fVar151 - (fVar127 * auVar63._8_4_ + fVar116 * auVar217._8_4_);
  fVar151 = fVar151 - (fVar127 * auVar63._12_4_ + fVar116 * auVar217._12_4_);
  auVar110._0_8_ = CONCAT44(fVar198 * fVar200,fVar198 * fVar225);
  auVar110._8_4_ = fVar198 * fVar226;
  auVar110._12_4_ = fVar198 * fVar213;
  auVar85._0_4_ = fVar198 * fVar199;
  auVar85._4_4_ = fVar198 * fVar215;
  auVar85._8_4_ = fVar198 * fVar152;
  auVar85._12_4_ = fVar198 * fVar214;
  auVar270._8_4_ = auVar110._8_4_;
  auVar270._0_8_ = auVar110._0_8_;
  auVar270._12_4_ = auVar110._12_4_;
  auVar119 = minps(auVar270,auVar85);
  auVar63 = maxps(auVar85,auVar110);
  auVar178._0_8_ = CONCAT44(fVar137 * fVar213,fVar137 * fVar226);
  auVar178._8_4_ = fVar137 * fVar227;
  auVar178._12_4_ = fVar137 * fVar233;
  auVar111._0_4_ = fVar137 * fVar152;
  auVar111._4_4_ = fVar137 * fVar214;
  auVar111._8_4_ = fVar137 * fVar183;
  auVar111._12_4_ = fVar137 * fVar95;
  auVar230._8_4_ = auVar178._8_4_;
  auVar230._0_8_ = auVar178._0_8_;
  auVar230._12_4_ = auVar178._12_4_;
  auVar102 = minps(auVar230,auVar111);
  auVar217 = maxps(auVar111,auVar178);
  fVar116 = 0.0 - (auVar217._0_4_ + auVar63._0_4_);
  fVar127 = 1.0 - (auVar217._4_4_ + auVar63._4_4_);
  fVar128 = 0.0 - (auVar217._8_4_ + auVar63._8_4_);
  fVar130 = 0.0 - (auVar217._12_4_ + auVar63._12_4_);
  fVar129 = 0.0 - (auVar102._0_4_ + auVar119._0_4_);
  fVar182 = 1.0 - (auVar102._4_4_ + auVar119._4_4_);
  fVar188 = 0.0 - (auVar102._8_4_ + auVar119._8_4_);
  fVar189 = 0.0 - (auVar102._12_4_ + auVar119._12_4_);
  auVar112._0_8_ = CONCAT44(fVar235 * fVar127,fVar234 * fVar116);
  auVar112._8_4_ = fVar242 * fVar128;
  auVar112._12_4_ = fVar244 * fVar130;
  auVar239._0_8_ = CONCAT44(fVar200 * fVar150,fVar225 * fVar150);
  auVar239._8_4_ = fVar226 * fVar150;
  auVar239._12_4_ = fVar213 * fVar150;
  auVar179._0_4_ = fVar150 * fVar199;
  auVar179._4_4_ = fVar150 * fVar215;
  auVar179._8_4_ = fVar150 * fVar152;
  auVar179._12_4_ = fVar150 * fVar214;
  auVar231._8_4_ = auVar239._8_4_;
  auVar231._0_8_ = auVar239._0_8_;
  auVar231._12_4_ = auVar239._12_4_;
  auVar217 = minps(auVar231,auVar179);
  auVar63 = maxps(auVar179,auVar239);
  auVar209._0_8_ = CONCAT44(fVar213 * fVar136,fVar226 * fVar136);
  auVar209._8_4_ = fVar227 * fVar136;
  auVar209._12_4_ = fVar233 * fVar136;
  auVar240._0_4_ = fVar136 * fVar152;
  auVar240._4_4_ = fVar136 * fVar214;
  auVar240._8_4_ = fVar136 * fVar183;
  auVar240._12_4_ = fVar136 * fVar95;
  auVar269._8_4_ = auVar209._8_4_;
  auVar269._0_8_ = auVar209._0_8_;
  auVar269._12_4_ = auVar209._12_4_;
  auVar119 = minps(auVar269,auVar240);
  auVar232._0_4_ = fVar234 * fVar129;
  auVar232._4_4_ = fVar235 * fVar182;
  auVar232._8_4_ = fVar242 * fVar188;
  auVar232._12_4_ = fVar244 * fVar189;
  auVar86._0_8_ = CONCAT44(fVar127 * fVar248,fVar116 * fVar246);
  auVar86._8_4_ = fVar128 * fVar184;
  auVar86._12_4_ = fVar130 * fVar190;
  auVar187._0_4_ = fVar129 * fVar246;
  auVar187._4_4_ = fVar182 * fVar248;
  auVar187._8_4_ = fVar188 * fVar184;
  auVar187._12_4_ = fVar189 * fVar190;
  auVar102 = maxps(auVar240,auVar209);
  fVar95 = 1.0 - (auVar102._0_4_ + auVar63._0_4_);
  fVar116 = 0.0 - (auVar102._4_4_ + auVar63._4_4_);
  fVar127 = 0.0 - (auVar102._8_4_ + auVar63._8_4_);
  fVar128 = 0.0 - (auVar102._12_4_ + auVar63._12_4_);
  fVar130 = 1.0 - (auVar119._0_4_ + auVar217._0_4_);
  fVar199 = 0.0 - (auVar119._4_4_ + auVar217._4_4_);
  fVar129 = 0.0 - (auVar119._8_4_ + auVar217._8_4_);
  fVar152 = 0.0 - (auVar119._12_4_ + auVar217._12_4_);
  auVar210._0_8_ = CONCAT44(fVar235 * fVar116,fVar234 * fVar95);
  auVar210._8_4_ = fVar242 * fVar127;
  auVar210._12_4_ = fVar244 * fVar128;
  auVar254._0_4_ = fVar234 * fVar130;
  auVar254._4_4_ = fVar235 * fVar199;
  auVar254._8_4_ = fVar242 * fVar129;
  auVar254._12_4_ = fVar244 * fVar152;
  auVar180._0_8_ = CONCAT44(fVar116 * fVar248,fVar95 * fVar246);
  auVar180._8_4_ = fVar127 * fVar184;
  auVar180._12_4_ = fVar128 * fVar190;
  auVar224._0_4_ = fVar130 * fVar246;
  auVar224._4_4_ = fVar199 * fVar248;
  auVar224._8_4_ = fVar129 * fVar184;
  auVar224._12_4_ = fVar152 * fVar190;
  auVar241._8_4_ = auVar210._8_4_;
  auVar241._0_8_ = auVar210._0_8_;
  auVar241._12_4_ = auVar210._12_4_;
  auVar63 = minps(auVar241,auVar254);
  auVar263._8_4_ = auVar180._8_4_;
  auVar263._0_8_ = auVar180._0_8_;
  auVar263._12_4_ = auVar180._12_4_;
  auVar264 = minps(auVar263,auVar224);
  auVar219 = minps(auVar63,auVar264);
  auVar217 = maxps(auVar254,auVar210);
  auVar63 = maxps(auVar224,auVar180);
  auVar102 = maxps(auVar63,auVar217);
  auVar211._8_4_ = auVar112._8_4_;
  auVar211._0_8_ = auVar112._0_8_;
  auVar211._12_4_ = auVar112._12_4_;
  auVar217 = minps(auVar211,auVar232);
  auVar181._8_4_ = auVar86._8_4_;
  auVar181._0_8_ = auVar86._0_8_;
  auVar181._12_4_ = auVar86._12_4_;
  auVar63 = minps(auVar181,auVar187);
  auVar217 = minps(auVar217,auVar63);
  auVar119 = maxps(auVar232,auVar112);
  auVar63 = maxps(auVar187,auVar86);
  auVar63 = maxps(auVar63,auVar119);
  auVar212._0_4_ = auVar219._4_4_ + auVar219._0_4_ + local_1ec;
  auVar212._4_4_ = auVar217._4_4_ + auVar217._0_4_ + fStack_1e8;
  auVar212._8_4_ = auVar219._8_4_ + auVar219._4_4_ + fVar135;
  auVar212._12_4_ = auVar219._12_4_ + auVar217._4_4_ + fVar151;
  fVar95 = auVar102._4_4_ + auVar102._0_4_ + local_1ec;
  fVar116 = auVar63._4_4_ + auVar63._0_4_ + fStack_1e8;
  auVar87._4_4_ = fVar116;
  auVar87._0_4_ = fVar95;
  auVar108 = maxps(_local_418,auVar212);
  auVar87._8_4_ = auVar102._8_4_ + auVar102._4_4_ + fVar135;
  auVar87._12_4_ = auVar102._12_4_ + auVar63._4_4_ + fVar151;
  auVar63 = minps(auVar87,auVar197);
  iVar49 = -(uint)(auVar63._0_4_ < auVar108._0_4_);
  iVar51 = -(uint)(auVar63._4_4_ < auVar108._4_4_);
  auVar88._4_4_ = iVar51;
  auVar88._0_4_ = iVar49;
  auVar88._8_4_ = iVar51;
  auVar88._12_4_ = iVar51;
  auVar82._8_8_ = auVar88._8_8_;
  auVar82._4_4_ = (float)iVar49;
  auVar82._0_4_ = (float)iVar49;
  iVar49 = movmskpd((uint)(fVar114 < 0.0),auVar82);
  if (iVar49 != 0) goto LAB_002d0d49;
  bVar41 = 0;
  if ((local_3e8 < auVar212._0_4_) && (fVar95 < fStack_3e4)) {
    bVar41 = -(fVar116 < fVar55) & fVar115 < auVar212._4_4_;
  }
  bVar41 = bVar47 | bVar41;
  uVar42 = (ulong)CONCAT31(uVar20,bVar41);
  if (bVar41 != 1) goto LAB_002d06ef;
  uVar42 = 0xc9;
  do {
    uVar42 = uVar42 - 1;
    auVar264 = local_b8;
    if (uVar42 == 0) goto LAB_002d0d49;
    fVar55 = 1.0 - local_1ec;
    fVar114 = local_1ec * local_1ec * local_1ec;
    fVar95 = local_1ec * local_1ec * 3.0 * fVar55;
    fVar115 = fVar55 * fVar55 * fVar55;
    fVar116 = local_1ec * 3.0 * fVar55 * fVar55;
    fVar55 = fVar115 * (float)local_2a8 +
             fVar116 * local_2b8 + fVar95 * (float)local_2c8 + fVar114 * local_b8._0_4_;
    fVar93 = fVar115 * local_2a8._4_4_ +
             fVar116 * fStack_2b4 + fVar95 * local_2c8._4_4_ + fVar114 * local_b8._4_4_;
    fVar94 = fVar115 * fStack_2a0 +
             fVar116 * (float)uStack_2b0 + fVar95 * fStack_2c0 + fVar114 * local_b8._8_4_;
    fVar95 = fVar115 * fStack_29c +
             fVar116 * uStack_2b0._4_4_ + fVar95 * fStack_2bc + fVar114 * local_b8._12_4_;
    fVar114 = (fVar94 - fVar55) * fStack_1e8;
    fVar116 = (fVar95 - fVar93) * fStack_1e8;
    fVar115 = (fVar94 - fVar55) * fStack_1e8 + fVar55;
    fVar94 = (fVar95 - fVar93) * fStack_1e8 + fVar93;
    local_1ec = local_1ec - (fVar94 * fVar136 + fVar115 * fVar150);
    fStack_1e8 = fStack_1e8 - (fVar94 * fVar137 + fVar115 * fVar198);
    fVar95 = ABS(fVar94);
    auVar82._0_8_ = CONCAT44(fVar94,fVar115) & 0x7fffffff7fffffff;
    auVar82._8_4_ = ABS(fVar114 + fVar55);
    auVar82._12_4_ = ABS(fVar116 + fVar93);
    auVar108._0_8_ = CONCAT44(fVar94,fVar94) & 0x7fffffff7fffffff;
    auVar108._8_4_ = fVar95;
    auVar108._12_4_ = fVar95;
    if (fVar95 <= ABS(fVar115)) {
      auVar108._0_4_ = ABS(fVar115);
    }
  } while (local_c8 <= auVar108._0_4_);
  if ((((local_1ec < 0.0) || (1.0 < local_1ec)) ||
      (auVar108._4_4_ = fStack_1e8, auVar108._0_4_ = fStack_1e8, auVar108._8_4_ = fStack_1e8,
      auVar108._12_4_ = fStack_1e8, fStack_1e8 < 0.0)) || (1.0 < fStack_1e8)) goto LAB_002d0d49;
  fVar115 = (pre->ray_space).vx.field_0.m128[2];
  fVar55 = (pre->ray_space).vy.field_0.m128[2];
  fVar93 = (pre->ray_space).vz.field_0.m128[2];
  fVar94 = (ray->org).field_0.m128[0];
  fVar95 = (ray->org).field_0.m128[1];
  fVar114 = (ray->org).field_0.m128[2];
  fVar116 = (ray->org).field_0.m128[3];
  auVar89._0_4_ = (local_368 - fVar94) * fVar115;
  auVar89._4_4_ = (fStack_364 - fVar95) * fVar55;
  auVar89._8_4_ = (fStack_360 - fVar114) * fVar93;
  auVar89._12_4_ = (fStack_35c - fVar116) * 0.0;
  auVar90._8_8_ = auVar89._8_8_;
  auVar90._0_8_ = auVar90._8_8_;
  auVar82._4_12_ = auVar90._4_12_;
  fVar137 = 1.0 - fStack_1e8;
  fVar136 = 1.0 - local_1ec;
  fVar127 = fVar136 * fVar136 * fVar136;
  fVar128 = local_1ec * 3.0 * fVar136 * fVar136;
  fVar135 = local_1ec * local_1ec * local_1ec;
  fVar130 = local_1ec * local_1ec * 3.0 * fVar136;
  auVar82._0_4_ =
       ((auVar89._8_4_ + auVar89._4_4_ + auVar89._0_4_) * fVar137 +
       ((fStack_350 - fVar114) * fVar93 +
       (fStack_354 - fVar95) * fVar55 + (local_358 - fVar94) * fVar115) * fStack_1e8) * fVar127 +
       (((fStack_370 - fVar114) * fVar93 +
        (fStack_374 - fVar95) * fVar55 + (local_378 - fVar94) * fVar115) * fVar137 +
       ((fStack_210 - fVar114) * fVar93 +
       (fStack_214 - fVar95) * fVar55 + (local_218 - fVar94) * fVar115) * fStack_1e8) * fVar128 +
       (((fStack_390 - fVar114) * fVar93 +
        (fStack_394 - fVar95) * fVar55 + (local_398 - fVar94) * fVar115) * fVar137 +
       ((fStack_3a0 - fVar114) * fVar93 +
       (fStack_3a4 - fVar95) * fVar55 + (local_3a8 - fVar94) * fVar115) * fStack_1e8) * fVar130 +
       (fVar137 * ((fStack_380 - fVar114) * fVar93 +
                  (fStack_384 - fVar95) * fVar55 + (local_388 - fVar94) * fVar115) +
       ((fStack_3c0 - fVar114) * fVar93 +
       (fStack_3c4 - fVar95) * fVar55 + (local_3c8 - fVar94) * fVar115) * fStack_1e8) * fVar135;
  if (auVar82._0_4_ < fVar116) goto LAB_002d0d49;
  fVar115 = ray->tfar;
  auVar264 = ZEXT416((uint)fVar115);
  if (fVar115 < auVar82._0_4_) goto LAB_002d0d49;
  fVar114 = 1.0 - fStack_1e8;
  fVar116 = 1.0 - fStack_1e8;
  fVar137 = 1.0 - fStack_1e8;
  fVar150 = 1.0 - fStack_1e8;
  fVar55 = local_378 * fVar114 + local_218 * fStack_1e8;
  fVar93 = fStack_374 * fVar116 + fStack_214 * fStack_1e8;
  fVar94 = fStack_370 * fVar137 + fStack_210 * fStack_1e8;
  fVar95 = fStack_36c * fVar150 + fStack_20c * fStack_1e8;
  fVar151 = local_398 * fVar114 + local_3a8 * fStack_1e8;
  fVar190 = fStack_394 * fVar116 + fStack_3a4 * fStack_1e8;
  fVar199 = fStack_390 * fVar137 + fStack_3a0 * fStack_1e8;
  fVar152 = fStack_38c * fVar150 + fStack_39c * fStack_1e8;
  fVar184 = fVar151 - fVar55;
  fVar198 = fVar190 - fVar93;
  fVar129 = fVar199 - fVar94;
  fVar182 = fVar152 - fVar95;
  auVar108._4_4_ = local_1ec;
  auVar108._0_4_ = local_1ec;
  auVar108._8_4_ = local_1ec;
  auVar108._12_4_ = local_1ec;
  fVar55 = (((fVar55 - (local_368 * fVar114 + local_358 * fStack_1e8)) * fVar136 +
            local_1ec * fVar184) * fVar136 +
           (fVar184 * fVar136 +
           ((fVar114 * local_388 + fStack_1e8 * local_3c8) - fVar151) * local_1ec) * local_1ec) *
           3.0;
  fVar93 = (((fVar93 - (fStack_364 * fVar116 + fStack_354 * fStack_1e8)) * fVar136 +
            local_1ec * fVar198) * fVar136 +
           (fVar198 * fVar136 +
           ((fVar116 * fStack_384 + fStack_1e8 * fStack_3c4) - fVar190) * local_1ec) * local_1ec) *
           3.0;
  fVar94 = (((fVar94 - (fStack_360 * fVar137 + fStack_350 * fStack_1e8)) * fVar136 +
            local_1ec * fVar129) * fVar136 +
           (fVar129 * fVar136 +
           ((fVar137 * fStack_380 + fStack_1e8 * fStack_3c0) - fVar199) * local_1ec) * local_1ec) *
           3.0;
  fVar95 = (((fVar95 - (fStack_35c * fVar150 + fStack_34c * fStack_1e8)) * fVar136 +
            local_1ec * fVar182) * fVar136 +
           (fVar182 * fVar136 +
           ((fVar150 * fStack_37c + fStack_1e8 * fStack_3bc) - fVar152) * local_1ec) * local_1ec) *
           3.0;
  pGVar5 = (context->scene->geometries).items[local_3d0].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar42 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002d1d56;
    fVar114 = fVar127 * local_198 + fVar128 * local_1a8 + fVar130 * local_1b8 + fVar135 * local_1c8;
    fVar116 = fVar127 * fStack_194 +
              fVar128 * fStack_1a4 + fVar130 * fStack_1b4 + fVar135 * fStack_1c4;
    fVar136 = fVar127 * fStack_190 +
              fVar128 * fStack_1a0 + fVar130 * fStack_1b0 + fVar135 * fStack_1c0;
    fVar127 = fVar127 * fStack_18c +
              fVar128 * fStack_19c + fVar130 * fStack_1ac + fVar135 * fStack_1bc;
    auVar108._0_4_ = fVar116 * fVar55 - fVar93 * fVar114;
    auVar108._4_4_ = fVar136 * fVar93 - fVar94 * fVar116;
    auVar108._8_4_ = fVar114 * fVar94 - fVar55 * fVar136;
    auVar108._12_4_ = fVar127 * fVar95 - fVar95 * fVar127;
    local_1f8 = CONCAT44(auVar108._8_4_,auVar108._4_4_);
    local_1f0 = auVar108._0_4_;
    local_1e4 = (int)_local_298;
    local_1e0 = (int)local_3d0;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar82._0_4_;
    local_3ec = 0xffffffff;
    local_288.valid = &local_3ec;
    local_288.geometryUserPtr = pGVar5->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002d1d0b:
      p_Var43 = context->args->filter;
      if ((p_Var43 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        auVar63 = (*p_Var43)(&local_288);
        auVar108._0_8_ = auVar63._8_8_;
        auVar82._0_8_ = auVar63._0_8_;
        auVar108._8_8_ = extraout_XMM1_Qb_00;
        auVar82._8_8_ = extraout_XMM0_Qb_00;
        p_Var43 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_002d1d48;
      }
      uVar42 = CONCAT71((int7)((ulong)p_Var43 >> 8),1);
      goto LAB_002d1d56;
    }
    auVar63 = (*pGVar5->occlusionFilterN)(&local_288);
    auVar108._0_8_ = auVar63._8_8_;
    auVar82._0_8_ = auVar63._0_8_;
    auVar108._8_8_ = extraout_XMM1_Qb;
    auVar82._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_002d1d0b;
LAB_002d1d48:
    auVar82 = ZEXT416((uint)fVar115);
    ray->tfar = fVar115;
  }
  uVar42 = 0;
LAB_002d1d56:
  bVar45 = bVar45 | (byte)uVar42;
  goto LAB_002d0d49;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }